

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_fma::forward
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  undefined4 uVar2;
  float fVar3;
  uint uVar4;
  int *piVar5;
  void *pvVar6;
  void *pvVar7;
  size_t sVar8;
  undefined4 *puVar9;
  float *pfVar10;
  void *pvVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined8 uVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  undefined1 (*pauVar28) [32];
  ulong uVar29;
  undefined1 (*pauVar30) [32];
  ulong uVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar50 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar48 [16];
  undefined1 auVar60 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar67;
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  __m128 pos;
  undefined1 auVar111 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar112 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar192 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar264 [16];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [16];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [64];
  long local_150;
  int local_140;
  long local_120;
  undefined1 local_108 [16];
  size_t local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int local_dc;
  undefined8 local_d8;
  int local_d0;
  size_t local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  long local_88;
  ulong local_80;
  Option opt_flatten;
  undefined1 auVar49 [32];
  undefined1 auVar52 [32];
  undefined1 auVar61 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).int8_scale_term != 0)) {
    iVar25 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar25;
  }
  iVar25 = cpu_support_x86_f16c();
  if ((iVar25 != 0) && (opt->use_fp16_storage == true)) {
    iVar25 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar25;
  }
  local_e0 = bottom_blob->dims;
  if (local_e0 == 2) {
    iVar25 = (this->super_InnerProduct).num_output;
    local_dc = bottom_blob->w;
    if (local_dc == (this->super_InnerProduct).weight_data_size / iVar25) {
      Mat::create(top_blob,iVar25,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                  opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      innerproduct_gemm_sse
                (bottom_blob,top_blob,&this->weight_data_tm,&(this->super_InnerProduct).bias_data,
                 (this->super_InnerProduct).activation_type,
                 &(this->super_InnerProduct).activation_params,opt);
      return 0;
    }
  }
  else {
    local_dc = bottom_blob->w;
  }
  piVar5 = bottom_blob->refcount;
  local_108._0_8_ = bottom_blob->data;
  local_108._8_8_ = bottom_blob->refcount;
  local_f8 = bottom_blob->elemsize;
  local_f0 = bottom_blob->elempack;
  local_e8 = bottom_blob->allocator;
  local_d8._0_4_ = bottom_blob->h;
  local_d8._4_4_ = bottom_blob->d;
  local_d0 = bottom_blob->c;
  local_c8 = bottom_blob->cstep;
  iVar25 = local_e0;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
    iVar25 = bottom_blob->dims;
  }
  local_140 = -100;
  if (iVar25 != 1) {
    auVar64[0] = opt->lightmode;
    auVar64[1] = opt->use_shader_pack8;
    auVar64[2] = opt->use_subgroup_ops;
    auVar64[3] = opt->use_reserved_0;
    auVar64._4_4_ = opt->num_threads;
    auVar64._8_8_ = opt->blob_allocator;
    auVar64._16_8_ = opt->workspace_allocator;
    auVar64._24_4_ = opt->openmp_blocktime;
    auVar64[0x1c] = opt->use_winograd_convolution;
    auVar64[0x1d] = opt->use_sgemm_convolution;
    auVar64[0x1e] = opt->use_int8_inference;
    auVar64[0x1f] = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.vulkan_device_index = opt->vulkan_device_index;
    opt_flatten.use_reserved_1 = opt->use_reserved_1;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_2 = opt->use_reserved_2;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_flatten.use_fp16_uniform = opt->use_fp16_uniform;
    opt_flatten.use_int8_uniform = opt->use_int8_uniform;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten._0_8_ = auVar64._0_8_;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    opt_flatten.workspace_allocator = (Allocator *)auVar64._16_8_;
    opt_flatten.openmp_blocktime = auVar64._24_4_;
    opt_flatten.use_winograd_convolution = (bool)auVar64[0x1c];
    opt_flatten.use_sgemm_convolution = (bool)auVar64[0x1d];
    opt_flatten.use_int8_inference = (bool)auVar64[0x1e];
    opt_flatten.use_vulkan_compute = (bool)auVar64[0x1f];
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,local_108);
    if ((local_108._0_8_ == 0) || ((long)local_d0 * local_c8 == 0)) goto LAB_002be686;
  }
  uVar4 = (this->super_InnerProduct).num_output;
  if (opt->use_packing_layout == true) {
    uVar26 = 8;
    if ((uVar4 & 7) != 0) {
      uVar26 = (uint)((uVar4 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar26 = 1;
  }
  Mat::create(top_blob,(int)uVar4 / (int)uVar26,(ulong)uVar26 * (local_f8 / (ulong)(long)local_f0),
              uVar26,opt->blob_allocator);
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar25 = (this->super_InnerProduct).activation_type;
    iVar34 = local_f0 * local_dc;
    iVar39 = top_blob->elempack;
    uVar4 = top_blob->w;
    pvVar6 = (this->super_InnerProduct).bias_data.data;
    uVar24 = local_108._0_8_;
    if (iVar39 == 1) {
      local_c0 = (long)iVar34;
      uVar31 = 0;
      local_90 = (ulong)(uint)((int)uVar4 >> 3);
      if ((int)uVar4 >> 3 < 1) {
        local_90 = uVar31;
      }
      local_98 = local_c0 * 0x20;
      lVar32 = local_c0 * 4;
      local_120 = local_c0 * 0x18;
      local_150 = local_c0 * 0x1c;
      auVar341._8_4_ = 0x3f000000;
      auVar341._0_8_ = 0x3f0000003f000000;
      auVar341._12_4_ = 0x3f000000;
      auVar341._16_4_ = 0x3f000000;
      auVar341._20_4_ = 0x3f000000;
      auVar341._24_4_ = 0x3f000000;
      auVar341._28_4_ = 0x3f000000;
      auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar342 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar29 = 0;
      lVar35 = local_c0 * 8;
      lVar38 = local_c0 * 0xc;
      lVar37 = local_c0 << 4;
      lVar1 = local_c0 * 0x14;
      while (lVar41 = lVar1, lVar40 = lVar37, lVar33 = lVar38, lVar27 = lVar35, uVar36 = uVar29,
            uVar36 != local_90) {
        local_88 = uVar36 * 8;
        auVar70 = ZEXT816(0);
        auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
        if (pvVar6 != (void *)0x0) {
          auVar65 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar6 + uVar36 * 0x20));
        }
        pvVar7 = (this->weight_data_tm).data;
        lVar38 = 0;
        lVar35 = 0;
        auVar83 = ZEXT816(0) << 0x40;
        auVar68 = ZEXT816(0) << 0x40;
        auVar48 = ZEXT816(0) << 0x40;
        auVar72 = ZEXT816(0) << 0x40;
        auVar188 = ZEXT816(0) << 0x40;
        auVar114 = ZEXT816(0) << 0x40;
        auVar111 = ZEXT816(0) << 0x40;
        iVar39 = 0;
        while( true ) {
          if (iVar34 <= iVar39 + 7) break;
          auVar64 = *(undefined1 (*) [32])((undefined1 *)local_108._0_8_ + lVar35);
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar64,
                                     *(undefined1 (*) [32])((long)pvVar7 + lVar35 + uVar31));
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar64,
                                     *(undefined1 (*) [32])((long)pvVar7 + lVar35 + lVar32));
          auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar64,
                                     *(undefined1 (*) [32])((long)pvVar7 + lVar35 + lVar27));
          auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar35 + lVar33));
          auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar35 + lVar40));
          auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar35 + lVar41));
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar35 + local_120));
          auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar35 + local_150));
          iVar39 = iVar39 + 8;
          lVar35 = lVar35 + 0x20;
          lVar38 = lVar38 + 8;
        }
        for (; (int)lVar38 < iVar34; lVar38 = lVar38 + 1) {
          auVar123 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar7 + lVar38 * 4 + lVar40)),
                                   ZEXT416(*(uint *)((long)pvVar7 + lVar38 * 4 + lVar41)),0x10);
          auVar123 = vinsertps_avx(auVar123,ZEXT416(*(uint *)((long)pvVar7 + lVar38 * 4 + local_120)
                                                   ),0x20);
          auVar123 = vinsertps_avx(auVar123,ZEXT416(*(uint *)((long)pvVar7 + lVar38 * 4 + local_150)
                                                   ),0x30);
          auVar82 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar7 + lVar38 * 4 + uVar31)),
                                  ZEXT416(*(uint *)((long)pvVar7 + lVar38 * 4 + lVar32)),0x10);
          auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)((long)pvVar7 + lVar38 * 4 + lVar27)),
                                  0x20);
          auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)((long)pvVar7 + lVar38 * 4 + lVar33)),
                                  0x30);
          auVar51._16_16_ = auVar123;
          auVar51._0_16_ = auVar82;
          uVar2 = *(undefined4 *)((undefined1 *)local_108._0_8_ + lVar38 * 4);
          auVar54._4_4_ = uVar2;
          auVar54._0_4_ = uVar2;
          auVar54._8_4_ = uVar2;
          auVar54._12_4_ = uVar2;
          auVar54._16_4_ = uVar2;
          auVar54._20_4_ = uVar2;
          auVar54._24_4_ = uVar2;
          auVar54._28_4_ = uVar2;
          auVar123 = vfmadd231ps_fma(auVar65._0_32_,auVar51,auVar54);
          auVar65 = ZEXT1664(auVar123);
        }
        auVar64 = vhaddps_avx(ZEXT1632(auVar111),ZEXT1632(auVar114));
        auVar51 = vhaddps_avx(ZEXT1632(auVar188),ZEXT1632(auVar72));
        auVar51 = vhaddps_avx(auVar64,auVar51);
        auVar64 = vhaddps_avx(ZEXT1632(auVar48),ZEXT1632(auVar68));
        auVar54 = vhaddps_avx(ZEXT1632(auVar83),ZEXT1632(auVar70));
        auVar54 = vhaddps_avx(auVar64,auVar54);
        auVar64 = vblendps_avx(auVar51,auVar54,0xf0);
        auVar51 = vperm2f128_avx(auVar51,auVar54,0x21);
        fVar42 = auVar51._0_4_ + auVar65._0_4_ + auVar64._0_4_;
        fVar67 = auVar51._4_4_ + auVar65._4_4_ + auVar64._4_4_;
        auVar242._0_8_ = CONCAT44(fVar67,fVar42);
        auVar242._8_4_ = auVar51._8_4_ + auVar65._8_4_ + auVar64._8_4_;
        auVar242._12_4_ = auVar51._12_4_ + auVar65._12_4_ + auVar64._12_4_;
        auVar242._16_4_ = auVar51._16_4_ + auVar65._16_4_ + auVar64._16_4_;
        auVar242._20_4_ = auVar51._20_4_ + auVar65._20_4_ + auVar64._20_4_;
        auVar242._24_4_ = auVar51._24_4_ + auVar65._24_4_ + auVar64._24_4_;
        auVar242._28_4_ = auVar51._28_4_ + auVar65._28_4_ + auVar64._28_4_;
        auVar64 = auVar242;
        if (5 < iVar25 - 1U) goto switchD_002bd9ad_caseD_1;
        auVar54 = auVar342._0_32_;
        auVar64 = vmaxps_avx(auVar54,auVar242);
        auVar51 = auVar218._0_32_;
        fVar3 = auVar218._0_4_;
        fVar157 = auVar218._4_4_;
        fVar12 = auVar218._8_4_;
        fVar13 = auVar218._12_4_;
        fVar14 = auVar218._16_4_;
        fVar15 = auVar218._20_4_;
        fVar16 = auVar218._24_4_;
        fVar17 = auVar218._28_4_;
        switch(iVar25) {
        case 2:
          auVar51 = vminps_avx(auVar54,auVar242);
          uVar2 = *(this->super_InnerProduct).activation_params.data;
          auVar151._4_4_ = uVar2;
          auVar151._0_4_ = uVar2;
          auVar151._8_4_ = uVar2;
          auVar151._12_4_ = uVar2;
          auVar151._16_4_ = uVar2;
          auVar151._20_4_ = uVar2;
          auVar151._24_4_ = uVar2;
          auVar151._28_4_ = uVar2;
          auVar70 = vfmadd231ps_fma(auVar64,auVar51,auVar151);
          auVar64 = ZEXT1632(auVar70);
          break;
        case 3:
          puVar9 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar2 = *puVar9;
          auVar59._4_4_ = uVar2;
          auVar59._0_4_ = uVar2;
          auVar59._8_4_ = uVar2;
          auVar59._12_4_ = uVar2;
          auVar59._16_4_ = uVar2;
          auVar59._20_4_ = uVar2;
          auVar59._24_4_ = uVar2;
          auVar59._28_4_ = uVar2;
          uVar2 = puVar9[1];
          auVar104._4_4_ = uVar2;
          auVar104._0_4_ = uVar2;
          auVar104._8_4_ = uVar2;
          auVar104._12_4_ = uVar2;
          auVar104._16_4_ = uVar2;
          auVar104._20_4_ = uVar2;
          auVar104._24_4_ = uVar2;
          auVar104._28_4_ = uVar2;
          auVar64 = vmaxps_avx(auVar242,auVar59);
          auVar64 = vminps_avx(auVar64,auVar104);
          break;
        case 4:
          auVar60._0_8_ = auVar242._0_8_ ^ 0x8000000080000000;
          auVar60._8_4_ = -auVar242._8_4_;
          auVar60._12_4_ = -auVar242._12_4_;
          auVar60._16_4_ = -auVar242._16_4_;
          auVar60._20_4_ = -auVar242._20_4_;
          auVar60._24_4_ = -auVar242._24_4_;
          auVar60._28_4_ = -auVar242._28_4_;
          auVar105._8_4_ = 0x42b0c0a5;
          auVar105._0_8_ = 0x42b0c0a542b0c0a5;
          auVar105._12_4_ = 0x42b0c0a5;
          auVar105._16_4_ = 0x42b0c0a5;
          auVar105._20_4_ = 0x42b0c0a5;
          auVar105._24_4_ = 0x42b0c0a5;
          auVar105._28_4_ = 0x42b0c0a5;
          auVar64 = vminps_avx(auVar60,auVar105);
          auVar106._8_4_ = 0xc2b0c0a5;
          auVar106._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar106._12_4_ = 0xc2b0c0a5;
          auVar106._16_4_ = 0xc2b0c0a5;
          auVar106._20_4_ = 0xc2b0c0a5;
          auVar106._24_4_ = 0xc2b0c0a5;
          auVar106._28_4_ = 0xc2b0c0a5;
          auVar54 = vmaxps_avx(auVar64,auVar106);
          auVar107._8_4_ = 0x3fb8aa3b;
          auVar107._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar107._12_4_ = 0x3fb8aa3b;
          auVar107._16_4_ = 0x3fb8aa3b;
          auVar107._20_4_ = 0x3fb8aa3b;
          auVar107._24_4_ = 0x3fb8aa3b;
          auVar107._28_4_ = 0x3fb8aa3b;
          auVar70 = vfmadd213ps_fma(auVar107,auVar54,auVar341);
          auVar242 = vroundps_avx(ZEXT1632(auVar70),1);
          auVar64 = vcmpps_avx(ZEXT1632(auVar70),auVar242,1);
          auVar64 = vandps_avx(auVar64,auVar51);
          auVar64 = vsubps_avx(auVar242,auVar64);
          auVar155._8_4_ = 0x3f318000;
          auVar155._0_8_ = 0x3f3180003f318000;
          auVar155._12_4_ = 0x3f318000;
          auVar155._16_4_ = 0x3f318000;
          auVar155._20_4_ = 0x3f318000;
          auVar155._24_4_ = 0x3f318000;
          auVar155._28_4_ = 0x3f318000;
          auVar70 = vfmsub231ps_fma(auVar54,auVar64,auVar155);
          auVar156._8_4_ = 0x395e8083;
          auVar156._0_8_ = 0x395e8083395e8083;
          auVar156._12_4_ = 0x395e8083;
          auVar156._16_4_ = 0x395e8083;
          auVar156._20_4_ = 0x395e8083;
          auVar156._24_4_ = 0x395e8083;
          auVar156._28_4_ = 0x395e8083;
          auVar111 = vfmsub231ps_fma(ZEXT1632(auVar70),auVar64,auVar156);
          auVar54 = ZEXT1632(auVar111);
          auVar23._28_4_ = 0x395e8083;
          auVar23._0_28_ =
               ZEXT1628(CONCAT412(auVar111._12_4_ * auVar111._12_4_,
                                  CONCAT48(auVar111._8_4_ * auVar111._8_4_,
                                           CONCAT44(auVar111._4_4_ * auVar111._4_4_,
                                                    auVar111._0_4_ * auVar111._0_4_))));
          auVar202._8_4_ = 0x39506967;
          auVar202._0_8_ = 0x3950696739506967;
          auVar202._12_4_ = 0x39506967;
          auVar202._16_4_ = 0x39506967;
          auVar202._20_4_ = 0x39506967;
          auVar202._24_4_ = 0x39506967;
          auVar202._28_4_ = 0x39506967;
          auVar243._8_4_ = 0x3ab743ce;
          auVar243._0_8_ = 0x3ab743ce3ab743ce;
          auVar243._12_4_ = 0x3ab743ce;
          auVar243._16_4_ = 0x3ab743ce;
          auVar243._20_4_ = 0x3ab743ce;
          auVar243._24_4_ = 0x3ab743ce;
          auVar243._28_4_ = 0x3ab743ce;
          auVar70 = vfmadd213ps_fma(auVar202,auVar54,auVar243);
          auVar217._8_4_ = 0x3c088908;
          auVar217._0_8_ = 0x3c0889083c088908;
          auVar217._12_4_ = 0x3c088908;
          auVar217._16_4_ = 0x3c088908;
          auVar217._20_4_ = 0x3c088908;
          auVar217._24_4_ = 0x3c088908;
          auVar217._28_4_ = 0x3c088908;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar217);
          auVar182._8_4_ = 0x3d2aa9c1;
          auVar182._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar182._12_4_ = 0x3d2aa9c1;
          auVar182._16_4_ = 0x3d2aa9c1;
          auVar182._20_4_ = 0x3d2aa9c1;
          auVar182._24_4_ = 0x3d2aa9c1;
          auVar182._28_4_ = 0x3d2aa9c1;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar182);
          auVar183._8_4_ = 0x3e2aaaaa;
          auVar183._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar183._12_4_ = 0x3e2aaaaa;
          auVar183._16_4_ = 0x3e2aaaaa;
          auVar183._20_4_ = 0x3e2aaaaa;
          auVar183._24_4_ = 0x3e2aaaaa;
          auVar183._28_4_ = 0x3e2aaaaa;
          auVar54 = ZEXT1632(auVar111);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar183);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar341);
          auVar114 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar23,auVar54);
          auVar48._0_4_ = (int)auVar64._0_4_;
          auVar48._4_4_ = (int)auVar64._4_4_;
          auVar48._8_4_ = (int)auVar64._8_4_;
          auVar48._12_4_ = (int)auVar64._12_4_;
          auVar61._16_4_ = (int)auVar64._16_4_;
          auVar61._0_16_ = auVar48;
          auVar61._20_4_ = (int)auVar64._20_4_;
          auVar61._24_4_ = (int)auVar64._24_4_;
          auVar61._28_4_ = (int)auVar64._28_4_;
          auVar111 = vpslld_avx(auVar48,0x17);
          auVar70 = vpslld_avx(auVar61._16_16_,0x17);
          auVar68._8_4_ = 0x3f800000;
          auVar68._0_8_ = 0x3f8000003f800000;
          auVar68._12_4_ = 0x3f800000;
          auVar70 = vpaddd_avx(auVar70,auVar68);
          auVar111 = vpaddd_avx(auVar111,auVar68);
          auVar62._16_16_ = auVar70;
          auVar62._0_16_ = auVar111;
          auVar108._0_4_ = auVar114._0_4_ + fVar3;
          auVar108._4_4_ = auVar114._4_4_ + fVar157;
          auVar108._8_4_ = auVar114._8_4_ + fVar12;
          auVar108._12_4_ = auVar114._12_4_ + fVar13;
          auVar108._16_4_ = fVar14 + 0.0;
          auVar108._20_4_ = fVar15 + 0.0;
          auVar108._24_4_ = fVar16 + 0.0;
          auVar108._28_4_ = fVar17 + 0.0;
          auVar70 = vfmadd213ps_fma(auVar62,auVar108,auVar51);
          auVar64 = vdivps_avx(auVar51,ZEXT1632(auVar70));
          break;
        case 5:
          auVar317._8_4_ = 0x42b0c0a5;
          auVar317._0_8_ = 0x42b0c0a542b0c0a5;
          auVar317._12_4_ = 0x42b0c0a5;
          auVar317._16_4_ = 0x42b0c0a5;
          auVar317._20_4_ = 0x42b0c0a5;
          auVar317._24_4_ = 0x42b0c0a5;
          auVar317._28_4_ = 0x42b0c0a5;
          auVar64 = vminps_avx(auVar317,auVar242);
          auVar326._8_4_ = 0xc2b0c0a5;
          auVar326._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar326._12_4_ = 0xc2b0c0a5;
          auVar326._16_4_ = 0xc2b0c0a5;
          auVar326._20_4_ = 0xc2b0c0a5;
          auVar326._24_4_ = 0xc2b0c0a5;
          auVar326._28_4_ = 0xc2b0c0a5;
          auVar54 = vmaxps_avx(auVar326,auVar64);
          auVar96._8_4_ = 0x3fb8aa3b;
          auVar96._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar96._12_4_ = 0x3fb8aa3b;
          auVar96._16_4_ = 0x3fb8aa3b;
          auVar96._20_4_ = 0x3fb8aa3b;
          auVar96._24_4_ = 0x3fb8aa3b;
          auVar96._28_4_ = 0x3fb8aa3b;
          auVar70 = vfmadd213ps_fma(auVar96,auVar54,auVar341);
          auVar63 = vroundps_avx(ZEXT1632(auVar70),1);
          auVar64 = vcmpps_avx(ZEXT1632(auVar70),auVar63,1);
          auVar64 = vandps_avx(auVar64,auVar51);
          auVar64 = vsubps_avx(auVar63,auVar64);
          auVar318._8_4_ = 0x3f318000;
          auVar318._0_8_ = 0x3f3180003f318000;
          auVar318._12_4_ = 0x3f318000;
          auVar318._16_4_ = 0x3f318000;
          auVar318._20_4_ = 0x3f318000;
          auVar318._24_4_ = 0x3f318000;
          auVar318._28_4_ = 0x3f318000;
          auVar70 = vfmsub231ps_fma(auVar54,auVar64,auVar318);
          auVar327._8_4_ = 0xb95e8083;
          auVar327._0_8_ = 0xb95e8083b95e8083;
          auVar327._12_4_ = 0xb95e8083;
          auVar327._16_4_ = 0xb95e8083;
          auVar327._20_4_ = 0xb95e8083;
          auVar327._24_4_ = 0xb95e8083;
          auVar327._28_4_ = 0xb95e8083;
          auVar111 = vfnmsub231ps_fma(ZEXT1632(auVar70),auVar64,auVar327);
          auVar54 = ZEXT1632(auVar111);
          auVar21._28_4_ = auVar63._28_4_;
          auVar21._0_28_ =
               ZEXT1628(CONCAT412(auVar111._12_4_ * auVar111._12_4_,
                                  CONCAT48(auVar111._8_4_ * auVar111._8_4_,
                                           CONCAT44(auVar111._4_4_ * auVar111._4_4_,
                                                    auVar111._0_4_ * auVar111._0_4_))));
          auVar233._8_4_ = 0x39506967;
          auVar233._0_8_ = 0x3950696739506967;
          auVar233._12_4_ = 0x39506967;
          auVar233._16_4_ = 0x39506967;
          auVar233._20_4_ = 0x39506967;
          auVar233._24_4_ = 0x39506967;
          auVar233._28_4_ = 0x39506967;
          auVar334._8_4_ = 0x3ab743ce;
          auVar334._0_8_ = 0x3ab743ce3ab743ce;
          auVar334._12_4_ = 0x3ab743ce;
          auVar334._16_4_ = 0x3ab743ce;
          auVar334._20_4_ = 0x3ab743ce;
          auVar334._24_4_ = 0x3ab743ce;
          auVar334._28_4_ = 0x3ab743ce;
          auVar70 = vfmadd213ps_fma(auVar233,auVar54,auVar334);
          auVar215._8_4_ = 0x3c088908;
          auVar215._0_8_ = 0x3c0889083c088908;
          auVar215._12_4_ = 0x3c088908;
          auVar215._16_4_ = 0x3c088908;
          auVar215._20_4_ = 0x3c088908;
          auVar215._24_4_ = 0x3c088908;
          auVar215._28_4_ = 0x3c088908;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar215);
          auVar337._8_4_ = 0x3d2aa9c1;
          auVar337._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar337._12_4_ = 0x3d2aa9c1;
          auVar337._16_4_ = 0x3d2aa9c1;
          auVar337._20_4_ = 0x3d2aa9c1;
          auVar337._24_4_ = 0x3d2aa9c1;
          auVar337._28_4_ = 0x3d2aa9c1;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar337);
          auVar258._8_4_ = 0x3e2aaaaa;
          auVar258._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar258._12_4_ = 0x3e2aaaaa;
          auVar258._16_4_ = 0x3e2aaaaa;
          auVar258._20_4_ = 0x3e2aaaaa;
          auVar258._24_4_ = 0x3e2aaaaa;
          auVar258._28_4_ = 0x3e2aaaaa;
          auVar54 = ZEXT1632(auVar111);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar258);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar341);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar21,auVar54);
          auVar152._0_4_ = auVar70._0_4_ + fVar3;
          auVar152._4_4_ = auVar70._4_4_ + fVar157;
          auVar152._8_4_ = auVar70._8_4_ + fVar12;
          auVar152._12_4_ = auVar70._12_4_ + fVar13;
          auVar152._16_4_ = fVar14 + 0.0;
          auVar152._20_4_ = fVar15 + 0.0;
          auVar152._24_4_ = fVar16 + 0.0;
          auVar152._28_4_ = fVar17 + 0.0;
          auVar70._0_4_ = (int)auVar64._0_4_;
          auVar70._4_4_ = (int)auVar64._4_4_;
          auVar70._8_4_ = (int)auVar64._8_4_;
          auVar70._12_4_ = (int)auVar64._12_4_;
          auVar55._16_4_ = (int)auVar64._16_4_;
          auVar55._0_16_ = auVar70;
          auVar55._20_4_ = (int)auVar64._20_4_;
          auVar55._24_4_ = (int)auVar64._24_4_;
          auVar55._28_4_ = (int)auVar64._28_4_;
          auVar111 = vpslld_avx(auVar70,0x17);
          auVar70 = vpslld_avx(auVar55._16_16_,0x17);
          auVar72._8_4_ = 0x3f800000;
          auVar72._0_8_ = 0x3f8000003f800000;
          auVar72._12_4_ = 0x3f800000;
          auVar70 = vpaddd_avx(auVar72,auVar70);
          auVar111 = vpaddd_avx(auVar72,auVar111);
          auVar56._16_16_ = auVar70;
          auVar56._0_16_ = auVar111;
          auVar114 = vfmadd213ps_fma(auVar56,auVar152,auVar51);
          auVar97._8_4_ = 0x800000;
          auVar97._0_8_ = 0x80000000800000;
          auVar97._12_4_ = 0x800000;
          auVar97._16_4_ = 0x800000;
          auVar97._20_4_ = 0x800000;
          auVar97._24_4_ = 0x800000;
          auVar97._28_4_ = 0x800000;
          auVar64 = vmaxps_avx(ZEXT1632(auVar114),auVar97);
          auVar111 = vpsrld_avx(auVar64._0_16_,0x17);
          auVar70 = vpsrld_avx(auVar64._16_16_,0x17);
          auVar259._8_4_ = 0x807fffff;
          auVar259._0_8_ = 0x807fffff807fffff;
          auVar259._12_4_ = 0x807fffff;
          auVar259._16_4_ = 0x807fffff;
          auVar259._20_4_ = 0x807fffff;
          auVar259._24_4_ = 0x807fffff;
          auVar259._28_4_ = 0x807fffff;
          auVar64 = vandps_avx(auVar259,auVar64);
          auVar63 = vorps_avx(auVar341,auVar64);
          auVar260._8_4_ = 0x3f3504f3;
          auVar260._0_8_ = 0x3f3504f33f3504f3;
          auVar260._12_4_ = 0x3f3504f3;
          auVar260._16_4_ = 0x3f3504f3;
          auVar260._20_4_ = 0x3f3504f3;
          auVar260._24_4_ = 0x3f3504f3;
          auVar260._28_4_ = 0x3f3504f3;
          auVar54 = vcmpps_avx(auVar260,auVar63,2);
          auVar64 = vandnps_avx(auVar54,auVar63);
          auVar216._8_4_ = 0xbf800000;
          auVar216._0_8_ = 0xbf800000bf800000;
          auVar216._12_4_ = 0xbf800000;
          auVar216._16_4_ = 0xbf800000;
          auVar216._20_4_ = 0xbf800000;
          auVar216._24_4_ = 0xbf800000;
          auVar216._28_4_ = 0xbf800000;
          auVar98._0_4_ = auVar64._0_4_ + auVar63._0_4_ + -1.0;
          auVar98._4_4_ = auVar64._4_4_ + auVar63._4_4_ + -1.0;
          auVar98._8_4_ = auVar64._8_4_ + auVar63._8_4_ + -1.0;
          auVar98._12_4_ = auVar64._12_4_ + auVar63._12_4_ + -1.0;
          auVar98._16_4_ = auVar64._16_4_ + auVar63._16_4_ + -1.0;
          auVar98._20_4_ = auVar64._20_4_ + auVar63._20_4_ + -1.0;
          auVar98._24_4_ = auVar64._24_4_ + auVar63._24_4_ + -1.0;
          auVar98._28_4_ = auVar64._28_4_ + auVar63._28_4_ + -1.0;
          auVar70 = vpsubd_avx(auVar70,auVar54._16_16_);
          auVar188._8_4_ = 0xffffff81;
          auVar188._0_8_ = 0xffffff81ffffff81;
          auVar188._12_4_ = 0xffffff81;
          auVar70 = vpaddd_avx(auVar188,auVar70);
          auVar111 = vpsubd_avx(auVar111,auVar54._0_16_);
          auVar111 = vpaddd_avx(auVar188,auVar111);
          auVar153._16_16_ = auVar70;
          auVar153._0_16_ = auVar111;
          auVar201._0_4_ = auVar98._0_4_ * auVar98._0_4_;
          auVar201._4_4_ = auVar98._4_4_ * auVar98._4_4_;
          auVar201._8_4_ = auVar98._8_4_ * auVar98._8_4_;
          auVar201._12_4_ = auVar98._12_4_ * auVar98._12_4_;
          auVar201._16_4_ = auVar98._16_4_ * auVar98._16_4_;
          auVar201._20_4_ = auVar98._20_4_ * auVar98._20_4_;
          auVar201._24_4_ = auVar98._24_4_ * auVar98._24_4_;
          auVar201._28_4_ = 0;
          auVar261._8_4_ = 0x3d9021bb;
          auVar261._0_8_ = 0x3d9021bb3d9021bb;
          auVar261._12_4_ = 0x3d9021bb;
          auVar261._16_4_ = 0x3d9021bb;
          auVar261._20_4_ = 0x3d9021bb;
          auVar261._24_4_ = 0x3d9021bb;
          auVar261._28_4_ = 0x3d9021bb;
          auVar292._8_4_ = 0xbdebd1b8;
          auVar292._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar292._12_4_ = 0xbdebd1b8;
          auVar292._16_4_ = 0xbdebd1b8;
          auVar292._20_4_ = 0xbdebd1b8;
          auVar292._24_4_ = 0xbdebd1b8;
          auVar292._28_4_ = 0xbdebd1b8;
          auVar70 = vfmadd213ps_fma(auVar261,auVar98,auVar292);
          auVar293._8_4_ = 0x3def251a;
          auVar293._0_8_ = 0x3def251a3def251a;
          auVar293._12_4_ = 0x3def251a;
          auVar293._16_4_ = 0x3def251a;
          auVar293._20_4_ = 0x3def251a;
          auVar293._24_4_ = 0x3def251a;
          auVar293._28_4_ = 0x3def251a;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar98,auVar293);
          auVar294._8_4_ = 0xbdfe5d4f;
          auVar294._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar294._12_4_ = 0xbdfe5d4f;
          auVar294._16_4_ = 0xbdfe5d4f;
          auVar294._20_4_ = 0xbdfe5d4f;
          auVar294._24_4_ = 0xbdfe5d4f;
          auVar294._28_4_ = 0xbdfe5d4f;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar98,auVar294);
          auVar295._8_4_ = 0x3e11e9bf;
          auVar295._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar295._12_4_ = 0x3e11e9bf;
          auVar295._16_4_ = 0x3e11e9bf;
          auVar295._20_4_ = 0x3e11e9bf;
          auVar295._24_4_ = 0x3e11e9bf;
          auVar295._28_4_ = 0x3e11e9bf;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar98,auVar295);
          auVar296._8_4_ = 0xbe2aae50;
          auVar296._0_8_ = 0xbe2aae50be2aae50;
          auVar296._12_4_ = 0xbe2aae50;
          auVar296._16_4_ = 0xbe2aae50;
          auVar296._20_4_ = 0xbe2aae50;
          auVar296._24_4_ = 0xbe2aae50;
          auVar296._28_4_ = 0xbe2aae50;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar98,auVar296);
          auVar297._8_4_ = 0x3e4cceac;
          auVar297._0_8_ = 0x3e4cceac3e4cceac;
          auVar297._12_4_ = 0x3e4cceac;
          auVar297._16_4_ = 0x3e4cceac;
          auVar297._20_4_ = 0x3e4cceac;
          auVar297._24_4_ = 0x3e4cceac;
          auVar297._28_4_ = 0x3e4cceac;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar98,auVar297);
          auVar298._8_4_ = 0xbe7ffffc;
          auVar298._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar298._12_4_ = 0xbe7ffffc;
          auVar298._16_4_ = 0xbe7ffffc;
          auVar298._20_4_ = 0xbe7ffffc;
          auVar298._24_4_ = 0xbe7ffffc;
          auVar298._28_4_ = 0xbe7ffffc;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar98,auVar298);
          auVar299._8_4_ = 0x3eaaaaaa;
          auVar299._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar299._12_4_ = 0x3eaaaaaa;
          auVar299._16_4_ = 0x3eaaaaaa;
          auVar299._20_4_ = 0x3eaaaaaa;
          auVar299._24_4_ = 0x3eaaaaaa;
          auVar299._28_4_ = 0x3eaaaaaa;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar98,auVar299);
          auVar262._0_4_ = auVar201._0_4_ * auVar98._0_4_ * auVar70._0_4_;
          auVar262._4_4_ = auVar201._4_4_ * auVar98._4_4_ * auVar70._4_4_;
          auVar262._8_4_ = auVar201._8_4_ * auVar98._8_4_ * auVar70._8_4_;
          auVar262._12_4_ = auVar201._12_4_ * auVar98._12_4_ * auVar70._12_4_;
          auVar262._16_4_ = auVar201._16_4_ * auVar98._16_4_ * 0.0;
          auVar262._20_4_ = auVar201._20_4_ * auVar98._20_4_ * 0.0;
          auVar262._24_4_ = auVar201._24_4_ * auVar98._24_4_ * 0.0;
          auVar262._28_4_ = 0;
          auVar54 = vcvtdq2ps_avx(auVar153);
          auVar70 = vfmadd231ps_fma(auVar262,auVar54,auVar327);
          auVar70 = vfmsub231ps_fma(ZEXT1632(auVar70),auVar341,auVar201);
          auVar64 = vcmpps_avx(ZEXT1632(auVar114),_DAT_0053be40,2);
          auVar63 = vsubps_avx(ZEXT1632(auVar70),auVar98);
          auVar70 = vfmsub231ps_fma(auVar63,auVar318,auVar54);
          auVar263._8_4_ = 0xc0000000;
          auVar263._0_8_ = 0xc0000000c0000000;
          auVar263._12_4_ = 0xc0000000;
          auVar263._16_4_ = 0xc0000000;
          auVar263._20_4_ = 0xc0000000;
          auVar263._24_4_ = 0xc0000000;
          auVar263._28_4_ = 0xc0000000;
          auVar99._0_4_ = auVar70._0_4_ * -2.0;
          auVar99._4_4_ = auVar70._4_4_ * -2.0;
          auVar99._8_4_ = auVar70._8_4_ * -2.0;
          auVar99._12_4_ = auVar70._12_4_ * -2.0;
          auVar99._16_4_ = 0x80000000;
          auVar99._20_4_ = 0x80000000;
          auVar99._24_4_ = 0x80000000;
          auVar99._28_4_ = 0;
          auVar154._8_4_ = 0x7fffffff;
          auVar154._0_8_ = 0x7fffffff7fffffff;
          auVar154._12_4_ = 0x7fffffff;
          auVar154._16_4_ = 0x7fffffff;
          auVar154._20_4_ = 0x7fffffff;
          auVar154._24_4_ = 0x7fffffff;
          auVar154._28_4_ = 0x7fffffff;
          auVar64 = vblendvps_avx(auVar99,auVar154,auVar64);
          auVar100._8_4_ = 0x42b0c0a5;
          auVar100._0_8_ = 0x42b0c0a542b0c0a5;
          auVar100._12_4_ = 0x42b0c0a5;
          auVar100._16_4_ = 0x42b0c0a5;
          auVar100._20_4_ = 0x42b0c0a5;
          auVar100._24_4_ = 0x42b0c0a5;
          auVar100._28_4_ = 0x42b0c0a5;
          auVar64 = vminps_avx(auVar64,auVar100);
          auVar101._8_4_ = 0xc2b0c0a5;
          auVar101._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar101._12_4_ = 0xc2b0c0a5;
          auVar101._16_4_ = 0xc2b0c0a5;
          auVar101._20_4_ = 0xc2b0c0a5;
          auVar101._24_4_ = 0xc2b0c0a5;
          auVar101._28_4_ = 0xc2b0c0a5;
          auVar54 = vmaxps_avx(auVar64,auVar101);
          auVar102._8_4_ = 0x3fb8aa3b;
          auVar102._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar102._12_4_ = 0x3fb8aa3b;
          auVar102._16_4_ = 0x3fb8aa3b;
          auVar102._20_4_ = 0x3fb8aa3b;
          auVar102._24_4_ = 0x3fb8aa3b;
          auVar102._28_4_ = 0x3fb8aa3b;
          auVar70 = vfmadd213ps_fma(auVar102,auVar54,auVar341);
          auVar63 = vroundps_avx(ZEXT1632(auVar70),1);
          auVar64 = vcmpps_avx(ZEXT1632(auVar70),auVar63,1);
          auVar64 = vandps_avx(auVar64,auVar51);
          auVar64 = vsubps_avx(auVar63,auVar64);
          auVar70 = vfmsub231ps_fma(auVar54,auVar64,auVar318);
          auVar111 = vfnmsub231ps_fma(ZEXT1632(auVar70),auVar64,auVar327);
          auVar54 = ZEXT1632(auVar111);
          auVar22._28_4_ = auVar63._28_4_;
          auVar22._0_28_ =
               ZEXT1628(CONCAT412(auVar111._12_4_ * auVar111._12_4_,
                                  CONCAT48(auVar111._8_4_ * auVar111._8_4_,
                                           CONCAT44(auVar111._4_4_ * auVar111._4_4_,
                                                    auVar111._0_4_ * auVar111._0_4_))));
          auVar218 = ZEXT3264(auVar51);
          auVar70 = vfmadd213ps_fma(auVar233,auVar54,auVar334);
          auVar342 = ZEXT864(0) << 0x20;
          auVar180._8_4_ = 0x3c088908;
          auVar180._0_8_ = 0x3c0889083c088908;
          auVar180._12_4_ = 0x3c088908;
          auVar180._16_4_ = 0x3c088908;
          auVar180._20_4_ = 0x3c088908;
          auVar180._24_4_ = 0x3c088908;
          auVar180._28_4_ = 0x3c088908;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar180);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar337);
          auVar181._8_4_ = 0x3e2aaaaa;
          auVar181._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar181._12_4_ = 0x3e2aaaaa;
          auVar181._16_4_ = 0x3e2aaaaa;
          auVar181._20_4_ = 0x3e2aaaaa;
          auVar181._24_4_ = 0x3e2aaaaa;
          auVar181._28_4_ = 0x3e2aaaaa;
          auVar54 = ZEXT1632(auVar111);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar181);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar341);
          auVar114 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar22,auVar54);
          auVar111._0_4_ = (int)auVar64._0_4_;
          auVar111._4_4_ = (int)auVar64._4_4_;
          auVar111._8_4_ = (int)auVar64._8_4_;
          auVar111._12_4_ = (int)auVar64._12_4_;
          auVar57._16_4_ = (int)auVar64._16_4_;
          auVar57._0_16_ = auVar111;
          auVar57._20_4_ = (int)auVar64._20_4_;
          auVar57._24_4_ = (int)auVar64._24_4_;
          auVar57._28_4_ = (int)auVar64._28_4_;
          auVar111 = vpslld_avx(auVar111,0x17);
          auVar70 = vpslld_avx(auVar57._16_16_,0x17);
          auVar70 = vpaddd_avx(auVar72,auVar70);
          auVar111 = vpaddd_avx(auVar72,auVar111);
          auVar58._16_16_ = auVar70;
          auVar58._0_16_ = auVar111;
          auVar103._0_4_ = auVar114._0_4_ + fVar3;
          auVar103._4_4_ = auVar114._4_4_ + fVar157;
          auVar103._8_4_ = auVar114._8_4_ + fVar12;
          auVar103._12_4_ = auVar114._12_4_ + fVar13;
          auVar103._16_4_ = fVar14 + 0.0;
          auVar103._20_4_ = fVar15 + 0.0;
          auVar103._24_4_ = fVar16 + 0.0;
          auVar103._28_4_ = fVar17 + 0.0;
          auVar70 = vfmadd213ps_fma(auVar58,auVar103,auVar51);
          auVar64 = vdivps_avx(auVar51,ZEXT1632(auVar70));
          auVar70 = vfnmadd213ps_fma(auVar64,auVar263,auVar216);
          auVar65 = ZEXT1664(auVar70);
          goto LAB_002bddcf;
        case 6:
          puVar9 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar2 = *puVar9;
          auVar63._4_4_ = uVar2;
          auVar63._0_4_ = uVar2;
          auVar63._8_4_ = uVar2;
          auVar63._12_4_ = uVar2;
          auVar63._16_4_ = uVar2;
          auVar63._20_4_ = uVar2;
          auVar63._24_4_ = uVar2;
          auVar63._28_4_ = uVar2;
          uVar2 = puVar9[1];
          auVar109._4_4_ = uVar2;
          auVar109._0_4_ = uVar2;
          auVar109._8_4_ = uVar2;
          auVar109._12_4_ = uVar2;
          auVar109._16_4_ = uVar2;
          auVar109._20_4_ = uVar2;
          auVar109._24_4_ = uVar2;
          auVar109._28_4_ = uVar2;
          auVar70 = vfmadd231ps_fma(auVar109,auVar242,auVar63);
          auVar64 = vmaxps_avx(auVar54,ZEXT1632(auVar70));
          auVar64 = vminps_avx(auVar64,auVar51);
          auVar65 = ZEXT3264(auVar64);
LAB_002bddcf:
          auVar66._0_4_ = auVar65._0_4_ * fVar42;
          auVar66._4_4_ = auVar65._4_4_ * fVar67;
          auVar66._8_4_ = auVar65._8_4_ * auVar242._8_4_;
          auVar66._12_4_ = auVar65._12_4_ * auVar242._12_4_;
          auVar66._16_4_ = auVar65._16_4_ * auVar242._16_4_;
          auVar66._20_4_ = auVar65._20_4_ * auVar242._20_4_;
          auVar66._28_36_ = auVar65._28_36_;
          auVar66._24_4_ = auVar65._24_4_ * auVar242._24_4_;
          auVar64 = auVar66._0_32_;
        }
switchD_002bd9ad_caseD_1:
        *(undefined1 (*) [32])((long)top_blob->data + uVar36 * 0x20) = auVar64;
        uVar31 = uVar31 + local_98;
        lVar32 = lVar32 + local_98;
        local_120 = local_120 + local_98;
        local_150 = local_150 + local_98;
        lVar35 = lVar27 + local_98;
        lVar38 = lVar33 + local_98;
        lVar37 = lVar40 + local_98;
        lVar1 = lVar41 + local_98;
        local_b8 = lVar41;
        local_b0 = lVar40;
        local_a8 = lVar33;
        local_a0 = lVar27;
        local_80 = uVar36;
        uVar29 = uVar36 + 1;
      }
      uVar31 = (long)(int)uVar4 & 0xfffffffffffffff8;
      uVar26 = uVar4 >> 2 & 1;
      lVar38 = local_c0 * uVar31 * 4;
      lVar35 = local_c0 * 0x10;
      lVar32 = (uVar31 + 1) * local_c0 * 4;
      local_120 = (uVar31 + 2) * local_c0 * 4;
      lVar37 = (uVar31 + 3) * local_c0 * 4;
      auVar218 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar114._8_4_ = 0x3ab743ce;
      auVar114._0_8_ = 0x3ab743ce3ab743ce;
      auVar114._12_4_ = 0x3ab743ce;
      for (uVar29 = 0; uVar29 != uVar26; uVar29 = uVar29 + 1) {
        lVar1 = uVar31 + uVar29 * 4;
        if (pvVar6 == (void *)0x0) {
          auVar70 = ZEXT816(0) << 0x40;
        }
        else {
          auVar70 = *(undefined1 (*) [16])((long)pvVar6 + lVar1 * 4);
        }
        pvVar7 = (this->weight_data_tm).data;
        lVar33 = 0;
        auVar111 = ZEXT816(0) << 0x40;
        lVar27 = 0;
        auVar188 = ZEXT816(0) << 0x40;
        auVar72 = ZEXT816(0) << 0x40;
        auVar48 = ZEXT816(0) << 0x40;
        iVar39 = 0;
        while( true ) {
          if (iVar34 <= iVar39 + 7) break;
          auVar64 = *(undefined1 (*) [32])((undefined1 *)local_108._0_8_ + lVar27);
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar64,
                                     *(undefined1 (*) [32])((long)pvVar7 + lVar27 + lVar38));
          auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar64,
                                     *(undefined1 (*) [32])((long)pvVar7 + lVar27 + lVar32));
          auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar27 + local_120));
          auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar27 + lVar37));
          iVar39 = iVar39 + 8;
          lVar27 = lVar27 + 0x20;
          lVar33 = lVar33 + 8;
        }
        auVar68 = ZEXT816(0) << 0x40;
        auVar83 = ZEXT816(0) << 0x40;
        auVar123 = ZEXT816(0) << 0x40;
        auVar82 = ZEXT816(0) << 0x40;
        for (; iVar39 + 3 < iVar34; iVar39 = iVar39 + 4) {
          auVar134 = *(undefined1 (*) [16])((undefined1 *)local_108._0_8_ + lVar27);
          auVar68 = vfmadd231ps_fma(auVar68,auVar134,
                                    *(undefined1 (*) [16])((long)pvVar7 + lVar27 + lVar38));
          auVar83 = vfmadd231ps_fma(auVar83,auVar134,
                                    *(undefined1 (*) [16])((long)pvVar7 + lVar27 + lVar32));
          auVar123 = vfmadd231ps_fma(auVar123,auVar134,
                                     *(undefined1 (*) [16])((long)pvVar7 + lVar27 + local_120));
          auVar82 = vfmadd231ps_fma(auVar82,auVar134,
                                    *(undefined1 (*) [16])((long)pvVar7 + lVar27 + lVar37));
          lVar27 = lVar27 + 0x10;
          lVar33 = lVar33 + 4;
        }
        for (; (int)lVar33 < iVar34; lVar33 = lVar33 + 1) {
          auVar134 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar7 + lVar33 * 4 + lVar38)),
                                   ZEXT416(*(uint *)((long)pvVar7 + lVar33 * 4 + lVar32)),0x10);
          auVar134 = vinsertps_avx(auVar134,ZEXT416(*(uint *)((long)pvVar7 + lVar33 * 4 + local_120)
                                                   ),0x20);
          auVar134 = vinsertps_avx(auVar134,ZEXT416(*(uint *)((long)pvVar7 + lVar33 * 4 + lVar37)),
                                   0x30);
          uVar2 = *(undefined4 *)((undefined1 *)local_108._0_8_ + lVar33 * 4);
          auVar309._4_4_ = uVar2;
          auVar309._0_4_ = uVar2;
          auVar309._8_4_ = uVar2;
          auVar309._12_4_ = uVar2;
          auVar70 = vfmadd231ps_fma(auVar70,auVar134,auVar309);
        }
        auVar64 = vhaddps_avx(ZEXT1632(auVar111),ZEXT1632(auVar188));
        auVar341 = vhaddps_avx(ZEXT1632(auVar72),ZEXT1632(auVar48));
        auVar64 = vhaddps_avx(auVar64,auVar341);
        auVar188 = vunpcklps_avx(auVar68,auVar83);
        auVar72 = vunpcklps_avx(auVar123,auVar82);
        auVar48 = vunpckhps_avx(auVar68,auVar83);
        auVar68 = vunpckhps_avx(auVar123,auVar82);
        auVar111 = vmovlhps_avx(auVar188,auVar72);
        auVar72 = vunpckhpd_avx(auVar188,auVar72);
        auVar188 = vmovlhps_avx(auVar48,auVar68);
        auVar48 = vunpckhpd_avx(auVar48,auVar68);
        auVar123._0_4_ =
             auVar64._16_4_ +
             auVar70._0_4_ + auVar72._0_4_ + auVar111._0_4_ + auVar188._0_4_ + auVar48._0_4_ +
             auVar64._0_4_;
        auVar123._4_4_ =
             auVar64._20_4_ +
             auVar70._4_4_ + auVar72._4_4_ + auVar111._4_4_ + auVar188._4_4_ + auVar48._4_4_ +
             auVar64._4_4_;
        auVar123._8_4_ =
             auVar64._24_4_ +
             auVar70._8_4_ + auVar72._8_4_ + auVar111._8_4_ + auVar188._8_4_ + auVar48._8_4_ +
             auVar64._8_4_;
        auVar123._12_4_ =
             auVar64._28_4_ +
             auVar70._12_4_ + auVar72._12_4_ + auVar111._12_4_ + auVar188._12_4_ + auVar48._12_4_ +
             auVar64._12_4_;
        auVar83 = auVar123;
        if (iVar25 - 1U < 6) {
          auVar70 = SUB6416(ZEXT864(0),0);
          auVar83 = vmaxps_avx(auVar123,auVar70);
          auVar111 = auVar218._0_16_;
          switch(iVar25) {
          case 2:
            auVar70 = vminps_avx(auVar123,auVar70);
            uVar2 = *(this->super_InnerProduct).activation_params.data;
            auVar204._4_4_ = uVar2;
            auVar204._0_4_ = uVar2;
            auVar204._8_4_ = uVar2;
            auVar204._12_4_ = uVar2;
            auVar83 = vfmadd231ps_fma(auVar83,auVar70,auVar204);
            break;
          case 3:
            puVar9 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar9;
            auVar79._4_4_ = uVar2;
            auVar79._0_4_ = uVar2;
            auVar79._8_4_ = uVar2;
            auVar79._12_4_ = uVar2;
            uVar2 = puVar9[1];
            auVar129._4_4_ = uVar2;
            auVar129._0_4_ = uVar2;
            auVar129._8_4_ = uVar2;
            auVar129._12_4_ = uVar2;
            auVar70 = vmaxps_avx(auVar123,auVar79);
            auVar83 = vminps_avx(auVar70,auVar129);
            break;
          case 4:
            uVar36 = CONCAT44(auVar123._4_4_,auVar123._0_4_);
            auVar80._0_8_ = uVar36 ^ 0x8000000080000000;
            auVar80._8_4_ = -auVar123._8_4_;
            auVar80._12_4_ = -auVar123._12_4_;
            auVar130._8_4_ = 0x42b0c0a5;
            auVar130._0_8_ = 0x42b0c0a542b0c0a5;
            auVar130._12_4_ = 0x42b0c0a5;
            auVar70 = vminps_avx(auVar80,auVar130);
            auVar131._8_4_ = 0xc2b0c0a5;
            auVar131._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar131._12_4_ = 0xc2b0c0a5;
            auVar72 = vmaxps_avx(auVar70,auVar131);
            auVar132._8_4_ = 0x3fb8aa3b;
            auVar132._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar132._12_4_ = 0x3fb8aa3b;
            auVar70 = vfmadd213ps_fma(auVar132,auVar72,auVar111);
            auVar211._0_4_ = (int)auVar70._0_4_;
            auVar211._4_4_ = (int)auVar70._4_4_;
            auVar211._8_4_ = (int)auVar70._8_4_;
            auVar211._12_4_ = (int)auVar70._12_4_;
            auVar188 = vcvtdq2ps_avx(auVar211);
            auVar70 = vcmpps_avx(auVar70,auVar188,1);
            auVar253._8_4_ = 0x3f800000;
            auVar253._0_8_ = 0x3f8000003f800000;
            auVar253._12_4_ = 0x3f800000;
            auVar70 = vandps_avx(auVar253,auVar70);
            auVar70 = vsubps_avx(auVar188,auVar70);
            auVar173._8_4_ = 0x3f318000;
            auVar173._0_8_ = 0x3f3180003f318000;
            auVar173._12_4_ = 0x3f318000;
            auVar188 = vfmsub231ps_fma(auVar72,auVar70,auVar173);
            auVar212._8_4_ = 0x395e8083;
            auVar212._0_8_ = 0x395e8083395e8083;
            auVar212._12_4_ = 0x395e8083;
            auVar72 = vfmsub231ps_fma(auVar188,auVar70,auVar212);
            auVar213._0_4_ = auVar72._0_4_ * auVar72._0_4_;
            auVar213._4_4_ = auVar72._4_4_ * auVar72._4_4_;
            auVar213._8_4_ = auVar72._8_4_ * auVar72._8_4_;
            auVar213._12_4_ = auVar72._12_4_ * auVar72._12_4_;
            auVar224._8_4_ = 0x39506967;
            auVar224._0_8_ = 0x3950696739506967;
            auVar224._12_4_ = 0x39506967;
            auVar277._8_4_ = 0x3ab743ce;
            auVar277._0_8_ = 0x3ab743ce3ab743ce;
            auVar277._12_4_ = 0x3ab743ce;
            auVar188 = vfmadd213ps_fma(auVar224,auVar72,auVar277);
            auVar240._8_4_ = 0x3c088908;
            auVar240._0_8_ = 0x3c0889083c088908;
            auVar240._12_4_ = 0x3c088908;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar240);
            auVar174._8_4_ = 0x3d2aa9c1;
            auVar174._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar174._12_4_ = 0x3d2aa9c1;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar174);
            auVar175._8_4_ = 0x3e2aaaaa;
            auVar175._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar175._12_4_ = 0x3e2aaaaa;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar175);
            auVar111 = vfmadd213ps_fma(auVar188,auVar72,auVar111);
            auVar111 = vfmadd213ps_fma(auVar111,auVar213,auVar72);
            auVar81._0_4_ = auVar111._0_4_ + 1.0;
            auVar81._4_4_ = auVar111._4_4_ + 1.0;
            auVar81._8_4_ = auVar111._8_4_ + 1.0;
            auVar81._12_4_ = auVar111._12_4_ + 1.0;
            auVar133._0_4_ = (int)auVar70._0_4_;
            auVar133._4_4_ = (int)auVar70._4_4_;
            auVar133._8_4_ = (int)auVar70._8_4_;
            auVar133._12_4_ = (int)auVar70._12_4_;
            auVar70 = vpslld_avx(auVar133,0x17);
            auVar70 = vpaddd_avx(auVar253,auVar70);
            auVar70 = vfmadd213ps_fma(auVar70,auVar81,auVar253);
            auVar83 = vdivps_avx(auVar253,auVar70);
            break;
          case 5:
            auVar320._8_4_ = 0x42b0c0a5;
            auVar320._0_8_ = 0x42b0c0a542b0c0a5;
            auVar320._12_4_ = 0x42b0c0a5;
            auVar70 = vminps_avx(auVar123,auVar320);
            auVar329._8_4_ = 0xc2b0c0a5;
            auVar329._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar329._12_4_ = 0xc2b0c0a5;
            auVar72 = vmaxps_avx(auVar329,auVar70);
            auVar339._8_4_ = 0x3fb8aa3b;
            auVar339._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar339._12_4_ = 0x3fb8aa3b;
            auVar70 = vfmadd213ps_fma(auVar339,auVar72,auVar111);
            auVar205._0_4_ = (int)auVar70._0_4_;
            auVar205._4_4_ = (int)auVar70._4_4_;
            auVar205._8_4_ = (int)auVar70._8_4_;
            auVar205._12_4_ = (int)auVar70._12_4_;
            auVar188 = vcvtdq2ps_avx(auVar205);
            auVar70 = vcmpps_avx(auVar70,auVar188,1);
            auVar310._8_4_ = 0x3f800000;
            auVar310._0_8_ = 0x3f8000003f800000;
            auVar310._12_4_ = 0x3f800000;
            auVar70 = vandps_avx(auVar310,auVar70);
            auVar70 = vsubps_avx(auVar188,auVar70);
            auVar170._8_4_ = 0x3f318000;
            auVar170._0_8_ = 0x3f3180003f318000;
            auVar170._12_4_ = 0x3f318000;
            auVar188 = vfmsub231ps_fma(auVar72,auVar70,auVar170);
            auVar321._8_4_ = 0xb95e8083;
            auVar321._0_8_ = 0xb95e8083b95e8083;
            auVar321._12_4_ = 0xb95e8083;
            auVar72 = vfnmsub231ps_fma(auVar188,auVar70,auVar321);
            auVar206._0_4_ = auVar72._0_4_ * auVar72._0_4_;
            auVar206._4_4_ = auVar72._4_4_ * auVar72._4_4_;
            auVar206._8_4_ = auVar72._8_4_ * auVar72._8_4_;
            auVar206._12_4_ = auVar72._12_4_ * auVar72._12_4_;
            auVar193._8_4_ = 0x39506967;
            auVar193._0_8_ = 0x3950696739506967;
            auVar193._12_4_ = 0x39506967;
            auVar188 = vfmadd213ps_fma(auVar193,auVar72,auVar114);
            auVar238._8_4_ = 0x3c088908;
            auVar238._0_8_ = 0x3c0889083c088908;
            auVar238._12_4_ = 0x3c088908;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar238);
            auVar239._8_4_ = 0x3d2aa9c1;
            auVar239._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar239._12_4_ = 0x3d2aa9c1;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar239);
            auVar250._8_4_ = 0x3e2aaaaa;
            auVar250._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar250._12_4_ = 0x3e2aaaaa;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar250);
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar111);
            auVar188 = vfmadd213ps_fma(auVar188,auVar206,auVar72);
            auVar207._0_4_ = auVar188._0_4_ + 1.0;
            auVar207._4_4_ = auVar188._4_4_ + 1.0;
            auVar207._8_4_ = auVar188._8_4_ + 1.0;
            auVar207._12_4_ = auVar188._12_4_ + 1.0;
            auVar76._0_4_ = (int)auVar70._0_4_;
            auVar76._4_4_ = (int)auVar70._4_4_;
            auVar76._8_4_ = (int)auVar70._8_4_;
            auVar76._12_4_ = (int)auVar70._12_4_;
            auVar70 = vpslld_avx(auVar76,0x17);
            auVar70 = vpaddd_avx(auVar310,auVar70);
            auVar68 = vfmadd213ps_fma(auVar70,auVar207,auVar310);
            auVar124._8_4_ = 0x800000;
            auVar124._0_8_ = 0x80000000800000;
            auVar124._12_4_ = 0x800000;
            auVar70 = vmaxps_avx(auVar68,auVar124);
            auVar188 = vpsrld_avx(auVar70,0x17);
            auVar220._8_4_ = 0xffffff82;
            auVar220._0_8_ = 0xffffff82ffffff82;
            auVar220._12_4_ = 0xffffff82;
            auVar188 = vpaddd_avx(auVar188,auVar220);
            auVar221._8_4_ = 0x807fffff;
            auVar221._0_8_ = 0x807fffff807fffff;
            auVar221._12_4_ = 0x807fffff;
            auVar70 = vandps_avx(auVar70,auVar221);
            auVar48 = vorps_avx(auVar70,auVar111);
            auVar72 = vcvtdq2ps_avx(auVar188);
            auVar222._8_4_ = 0x3f3504f3;
            auVar222._0_8_ = 0x3f3504f33f3504f3;
            auVar222._12_4_ = 0x3f3504f3;
            auVar188 = vcmpps_avx(auVar48,auVar222,1);
            auVar70 = vandps_avx(auVar188,auVar48);
            auVar125._0_4_ = auVar70._0_4_ + auVar48._0_4_ + -1.0;
            auVar125._4_4_ = auVar70._4_4_ + auVar48._4_4_ + -1.0;
            auVar125._8_4_ = auVar70._8_4_ + auVar48._8_4_ + -1.0;
            auVar125._12_4_ = auVar70._12_4_ + auVar48._12_4_ + -1.0;
            auVar70 = vandps_avx(auVar310,auVar188);
            auVar188 = vsubps_avx(auVar72,auVar70);
            auVar223._0_4_ = auVar125._0_4_ * auVar125._0_4_;
            auVar223._4_4_ = auVar125._4_4_ * auVar125._4_4_;
            auVar223._8_4_ = auVar125._8_4_ * auVar125._8_4_;
            auVar223._12_4_ = auVar125._12_4_ * auVar125._12_4_;
            auVar251._8_4_ = 0x3d9021bb;
            auVar251._0_8_ = 0x3d9021bb3d9021bb;
            auVar251._12_4_ = 0x3d9021bb;
            auVar269._8_4_ = 0xbdebd1b8;
            auVar269._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar269._12_4_ = 0xbdebd1b8;
            auVar70 = vfmadd213ps_fma(auVar251,auVar125,auVar269);
            auVar270._8_4_ = 0x3def251a;
            auVar270._0_8_ = 0x3def251a3def251a;
            auVar270._12_4_ = 0x3def251a;
            auVar70 = vfmadd213ps_fma(auVar70,auVar125,auVar270);
            auVar271._8_4_ = 0xbdfe5d4f;
            auVar271._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar271._12_4_ = 0xbdfe5d4f;
            auVar70 = vfmadd213ps_fma(auVar70,auVar125,auVar271);
            auVar272._8_4_ = 0x3e11e9bf;
            auVar272._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar272._12_4_ = 0x3e11e9bf;
            auVar70 = vfmadd213ps_fma(auVar70,auVar125,auVar272);
            auVar273._8_4_ = 0xbe2aae50;
            auVar273._0_8_ = 0xbe2aae50be2aae50;
            auVar273._12_4_ = 0xbe2aae50;
            auVar70 = vfmadd213ps_fma(auVar70,auVar125,auVar273);
            auVar274._8_4_ = 0x3e4cceac;
            auVar274._0_8_ = 0x3e4cceac3e4cceac;
            auVar274._12_4_ = 0x3e4cceac;
            auVar70 = vfmadd213ps_fma(auVar70,auVar125,auVar274);
            auVar275._8_4_ = 0xbe7ffffc;
            auVar275._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar275._12_4_ = 0xbe7ffffc;
            auVar70 = vfmadd213ps_fma(auVar70,auVar125,auVar275);
            auVar276._8_4_ = 0x3eaaaaaa;
            auVar276._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar276._12_4_ = 0x3eaaaaaa;
            auVar70 = vfmadd213ps_fma(auVar70,auVar125,auVar276);
            auVar252._0_4_ = auVar223._0_4_ * auVar125._0_4_ * auVar70._0_4_;
            auVar252._4_4_ = auVar223._4_4_ * auVar125._4_4_ * auVar70._4_4_;
            auVar252._8_4_ = auVar223._8_4_ * auVar125._8_4_ * auVar70._8_4_;
            auVar252._12_4_ = auVar223._12_4_ * auVar125._12_4_ * auVar70._12_4_;
            auVar70 = vfmadd231ps_fma(auVar252,auVar188,auVar321);
            auVar72 = vfmsub231ps_fma(auVar70,auVar111,auVar223);
            auVar70 = vcmpps_avx(auVar68,_DAT_00538060,2);
            auVar72 = vsubps_avx(auVar72,auVar125);
            auVar188 = vfnmadd231ps_fma(auVar72,auVar170,auVar188);
            auVar126._0_4_ = auVar188._0_4_ + auVar188._0_4_;
            auVar126._4_4_ = auVar188._4_4_ + auVar188._4_4_;
            auVar126._8_4_ = auVar188._8_4_ + auVar188._8_4_;
            auVar126._12_4_ = auVar188._12_4_ + auVar188._12_4_;
            auVar208._8_4_ = 0x7fffffff;
            auVar208._0_8_ = 0x7fffffff7fffffff;
            auVar208._12_4_ = 0x7fffffff;
            auVar70 = vblendvps_avx(auVar126,auVar208,auVar70);
            auVar127._8_4_ = 0x42b0c0a5;
            auVar127._0_8_ = 0x42b0c0a542b0c0a5;
            auVar127._12_4_ = 0x42b0c0a5;
            auVar70 = vminps_avx(auVar70,auVar127);
            auVar72 = vmaxps_avx(auVar329,auVar70);
            auVar70 = vfmadd213ps_fma(auVar339,auVar72,auVar111);
            auVar209._0_4_ = (int)auVar70._0_4_;
            auVar209._4_4_ = (int)auVar70._4_4_;
            auVar209._8_4_ = (int)auVar70._8_4_;
            auVar209._12_4_ = (int)auVar70._12_4_;
            auVar188 = vcvtdq2ps_avx(auVar209);
            auVar70 = vcmpps_avx(auVar70,auVar188,1);
            auVar70 = vandps_avx(auVar310,auVar70);
            auVar70 = vsubps_avx(auVar188,auVar70);
            auVar188 = vfmsub231ps_fma(auVar72,auVar70,auVar170);
            auVar72 = vfnmsub231ps_fma(auVar188,auVar70,auVar321);
            auVar210._0_4_ = auVar72._0_4_ * auVar72._0_4_;
            auVar210._4_4_ = auVar72._4_4_ * auVar72._4_4_;
            auVar210._8_4_ = auVar72._8_4_ * auVar72._8_4_;
            auVar210._12_4_ = auVar72._12_4_ * auVar72._12_4_;
            auVar218 = ZEXT1664(auVar111);
            auVar188 = vfmadd213ps_fma(auVar193,auVar72,auVar114);
            auVar171._8_4_ = 0x3c088908;
            auVar171._0_8_ = 0x3c0889083c088908;
            auVar171._12_4_ = 0x3c088908;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar171);
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar239);
            auVar172._8_4_ = 0x3e2aaaaa;
            auVar172._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar172._12_4_ = 0x3e2aaaaa;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar172);
            auVar111 = vfmadd213ps_fma(auVar188,auVar72,auVar111);
            auVar111 = vfmadd213ps_fma(auVar111,auVar210,auVar72);
            auVar77._0_4_ = auVar111._0_4_ + 1.0;
            auVar77._4_4_ = auVar111._4_4_ + 1.0;
            auVar77._8_4_ = auVar111._8_4_ + 1.0;
            auVar77._12_4_ = auVar111._12_4_ + 1.0;
            auVar128._0_4_ = (int)auVar70._0_4_;
            auVar128._4_4_ = (int)auVar70._4_4_;
            auVar128._8_4_ = (int)auVar70._8_4_;
            auVar128._12_4_ = (int)auVar70._12_4_;
            auVar70 = vpslld_avx(auVar128,0x17);
            auVar70 = vpaddd_avx(auVar310,auVar70);
            auVar70 = vfmadd213ps_fma(auVar70,auVar77,auVar310);
            auVar78._8_4_ = 0x40000000;
            auVar78._0_8_ = 0x4000000040000000;
            auVar78._12_4_ = 0x40000000;
            auVar70 = vdivps_avx(auVar78,auVar70);
            auVar83 = vfmsub213ps_fma(auVar70,auVar123,auVar123);
            break;
          case 6:
            puVar9 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar9;
            auVar82._4_4_ = uVar2;
            auVar82._0_4_ = uVar2;
            auVar82._8_4_ = uVar2;
            auVar82._12_4_ = uVar2;
            uVar2 = puVar9[1];
            auVar134._4_4_ = uVar2;
            auVar134._0_4_ = uVar2;
            auVar134._8_4_ = uVar2;
            auVar134._12_4_ = uVar2;
            auVar111 = vfmadd231ps_fma(auVar134,auVar123,auVar82);
            auVar70 = vmaxps_avx(auVar111,auVar70);
            auVar135._8_4_ = 0x3f800000;
            auVar135._0_8_ = 0x3f8000003f800000;
            auVar135._12_4_ = 0x3f800000;
            auVar70 = vminps_avx(auVar70,auVar135);
            auVar83._0_4_ = auVar123._0_4_ * auVar70._0_4_;
            auVar83._4_4_ = auVar123._4_4_ * auVar70._4_4_;
            auVar83._8_4_ = auVar123._8_4_ * auVar70._8_4_;
            auVar83._12_4_ = auVar123._12_4_ * auVar70._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + lVar1 * 4) = auVar83;
        lVar38 = lVar38 + lVar35;
        lVar32 = lVar32 + lVar35;
        local_120 = local_120 + lVar35;
        lVar37 = lVar37 + lVar35;
      }
      pfVar10 = (float *)(this->super_InnerProduct).activation_params.data;
      pvVar7 = (this->weight_data_tm).data;
      pvVar11 = top_blob->data;
      local_140 = 0;
      for (lVar32 = (long)(int)((int)uVar31 + uVar26 * 4); lVar32 < (int)uVar4; lVar32 = lVar32 + 1)
      {
        if (pvVar6 == (void *)0x0) {
          auVar218 = ZEXT1664(ZEXT816(0) << 0x40);
        }
        else {
          auVar218 = ZEXT464(*(uint *)((long)pvVar6 + lVar32 * 4));
        }
        pauVar28 = (undefined1 (*) [32])((long)pvVar7 + lVar32 * local_c0 * 4);
        auVar70 = ZEXT816(0) << 0x40;
        pauVar30 = (undefined1 (*) [32])uVar24;
        for (iVar39 = 0; iVar39 + 7 < iVar34; iVar39 = iVar39 + 8) {
          auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),*pauVar30,*pauVar28);
          pauVar30 = pauVar30 + 1;
          pauVar28 = pauVar28 + 1;
        }
        auVar111 = ZEXT816(0) << 0x40;
        for (; iVar39 + 3 < iVar34; iVar39 = iVar39 + 4) {
          auVar111 = vfmadd231ps_fma(auVar111,*(undefined1 (*) [16])*pauVar30,
                                     *(undefined1 (*) [16])*pauVar28);
          pauVar30 = (undefined1 (*) [32])(*pauVar30 + 0x10);
          pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
        }
        lVar35 = 0;
        for (; iVar39 < iVar34; iVar39 = iVar39 + 1) {
          auVar114 = vfmadd231ss_fma(auVar218._0_16_,ZEXT416(*(uint *)(*pauVar28 + lVar35)),
                                     ZEXT416(*(uint *)(*pauVar30 + lVar35)));
          auVar218 = ZEXT1664(auVar114);
          lVar35 = lVar35 + 4;
        }
        auVar84._0_4_ = auVar70._0_4_ + auVar111._0_4_ + 0.0;
        auVar84._4_4_ = auVar70._4_4_ + auVar111._4_4_ + 0.0;
        auVar84._8_4_ = auVar70._8_4_ + auVar111._8_4_ + 0.0;
        auVar84._12_4_ = auVar70._12_4_ + auVar111._12_4_ + 0.0;
        auVar70 = vhaddps_avx(auVar84,auVar84);
        auVar70 = vhaddps_avx(auVar70,auVar70);
        fVar42 = auVar70._0_4_ + auVar218._0_4_;
        auVar70 = ZEXT416((uint)fVar42);
        fVar67 = fVar42;
        switch(iVar25) {
        case 1:
          auVar70 = vmaxss_avx(auVar70,ZEXT416(0));
          fVar67 = auVar70._0_4_;
          break;
        case 2:
          auVar70 = vcmpss_avx(ZEXT816(0) << 0x40,auVar70,1);
          auVar137._8_4_ = 0x3f800000;
          auVar137._0_8_ = 0x3f8000003f800000;
          auVar137._12_4_ = 0x3f800000;
          auVar70 = vblendvps_avx(ZEXT416((uint)*pfVar10),auVar137,auVar70);
          fVar67 = auVar70._0_4_ * fVar42;
          break;
        case 3:
          auVar70 = vmaxss_avx(auVar70,ZEXT416((uint)*pfVar10));
          fVar67 = auVar70._0_4_;
          if (pfVar10[1] < auVar70._0_4_) {
            fVar67 = pfVar10[1];
          }
          break;
        case 4:
          auVar70 = vminss_avx(auVar70,ZEXT416(0x42b0c0a5));
          auVar85._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
          auVar85._8_4_ = auVar70._8_4_ ^ 0x80000000;
          auVar85._12_4_ = auVar70._12_4_ ^ 0x80000000;
          auVar70 = vcmpss_avx(auVar70,ZEXT416(0xc2b0c0a5),1);
          auVar136._8_4_ = 0x42b0c0a5;
          auVar136._0_8_ = 0x42b0c0a542b0c0a5;
          auVar136._12_4_ = 0x42b0c0a5;
          auVar70 = vblendvps_avx(auVar85,auVar136,auVar70);
          fVar42 = expf(auVar70._0_4_);
          fVar67 = 1.0 / (fVar42 + 1.0);
          break;
        case 5:
          fVar67 = expf(fVar42);
          fVar67 = logf(fVar67 + 1.0);
          fVar67 = tanhf(fVar67);
          fVar67 = fVar67 * fVar42;
          break;
        case 6:
          fVar3 = *pfVar10;
          fVar157 = -pfVar10[1] / fVar3;
          fVar67 = 0.0;
          if ((fVar157 <= fVar42) && (fVar67 = fVar42, fVar42 <= fVar157 + 1.0 / fVar3)) {
            auVar70 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar70,ZEXT416((uint)pfVar10[1]));
            fVar67 = auVar70._0_4_ * fVar42;
          }
        }
        *(float *)((long)pvVar11 + lVar32 * 4) = fVar67;
      }
    }
    else if (iVar39 == 4) {
      local_140 = 0;
      uVar31 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar31 = 0;
      }
      auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar218 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar342 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar335._8_4_ = 0x3ab743ce;
      auVar335._0_8_ = 0x3ab743ce3ab743ce;
      auVar335._12_4_ = 0x3ab743ce;
      for (uVar29 = 0; uVar29 != uVar31; uVar29 = uVar29 + 1) {
        if (pvVar6 == (void *)0x0) {
          auVar70 = ZEXT816(0) << 0x40;
        }
        else {
          auVar70 = *(undefined1 (*) [16])((long)pvVar6 + uVar29 * 0x10);
        }
        pvVar7 = (this->weight_data_tm).data;
        sVar8 = (this->weight_data_tm).elemsize;
        lVar32 = (long)(this->weight_data_tm).w;
        pauVar30 = (undefined1 (*) [32])(uVar29 * lVar32 * sVar8 + (long)pvVar7);
        lVar35 = 0;
        auVar72 = ZEXT816(0) << 0x40;
        lVar38 = 0;
        auVar188 = ZEXT816(0) << 0x40;
        auVar114 = ZEXT816(0) << 0x40;
        auVar111 = ZEXT816(0) << 0x40;
        pauVar28 = (undefined1 (*) [32])local_108._0_8_;
        for (iVar39 = 0; iVar39 + 7 < iVar34; iVar39 = iVar39 + 8) {
          uVar2 = *(undefined4 *)*pauVar28;
          auVar198._4_4_ = uVar2;
          auVar198._0_4_ = uVar2;
          auVar198._8_4_ = uVar2;
          auVar198._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar28 + 4);
          auVar198._20_4_ = uVar2;
          auVar198._16_4_ = uVar2;
          auVar198._24_4_ = uVar2;
          auVar198._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar28 + 8);
          auVar290._4_4_ = uVar2;
          auVar290._0_4_ = uVar2;
          auVar290._8_4_ = uVar2;
          auVar290._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar28 + 0xc);
          auVar290._20_4_ = uVar2;
          auVar290._16_4_ = uVar2;
          auVar290._24_4_ = uVar2;
          auVar290._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar28 + 0x10);
          auVar316._4_4_ = uVar2;
          auVar316._0_4_ = uVar2;
          auVar316._8_4_ = uVar2;
          auVar316._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar28 + 0x14);
          auVar316._20_4_ = uVar2;
          auVar316._16_4_ = uVar2;
          auVar316._24_4_ = uVar2;
          auVar316._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar28 + 0x18);
          auVar199._4_4_ = uVar2;
          auVar199._0_4_ = uVar2;
          auVar199._8_4_ = uVar2;
          auVar199._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar28 + 0x1c);
          auVar199._20_4_ = uVar2;
          auVar199._16_4_ = uVar2;
          auVar199._24_4_ = uVar2;
          auVar199._28_4_ = uVar2;
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar198,*pauVar30);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar290,pauVar30[1]);
          auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar316,pauVar30[2]);
          auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar199,pauVar30[3]);
          pauVar28 = pauVar28 + 1;
          pauVar30 = pauVar30 + 4;
          lVar38 = lVar38 + 0x20;
          lVar35 = lVar35 + 8;
        }
        lVar32 = sVar8 * uVar29 * lVar32;
        for (; iVar39 + 3 < iVar34; iVar39 = iVar39 + 4) {
          uVar2 = *(undefined4 *)((undefined1 *)local_108._0_8_ + lVar38 + 4);
          auVar200._20_4_ = uVar2;
          auVar200._16_4_ = uVar2;
          auVar200._24_4_ = uVar2;
          auVar200._28_4_ = uVar2;
          uVar2 = *(undefined4 *)((undefined1 *)local_108._0_8_ + lVar38);
          auVar200._4_4_ = uVar2;
          auVar200._0_4_ = uVar2;
          auVar200._8_4_ = uVar2;
          auVar200._12_4_ = uVar2;
          uVar2 = *(undefined4 *)((undefined1 *)local_108._0_8_ + lVar38 + 0xc);
          auVar291._20_4_ = uVar2;
          auVar291._16_4_ = uVar2;
          auVar291._24_4_ = uVar2;
          auVar291._28_4_ = uVar2;
          uVar2 = *(undefined4 *)((undefined1 *)local_108._0_8_ + lVar38 + 8);
          auVar291._4_4_ = uVar2;
          auVar291._0_4_ = uVar2;
          auVar291._8_4_ = uVar2;
          auVar291._12_4_ = uVar2;
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar200,
                                     *(undefined1 (*) [32])((long)pvVar7 + lVar38 * 4 + lVar32));
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar291,
                                     *(undefined1 (*) [32])
                                      ((long)pvVar7 + lVar38 * 4 + lVar32 + 0x20));
          pauVar30 = pauVar30 + 2;
          lVar38 = lVar38 + 0x10;
          lVar35 = lVar35 + 4;
        }
        for (; (int)lVar35 < iVar34; lVar35 = lVar35 + 1) {
          uVar2 = *(undefined4 *)((undefined1 *)local_108._0_8_ + lVar35 * 4);
          auVar184._4_4_ = uVar2;
          auVar184._0_4_ = uVar2;
          auVar184._8_4_ = uVar2;
          auVar184._12_4_ = uVar2;
          auVar70 = vfmadd231ps_fma(auVar70,auVar184,*(undefined1 (*) [16])*pauVar30);
          pauVar30 = (undefined1 (*) [32])(*pauVar30 + 0x10);
        }
        auVar73._0_4_ =
             auVar70._0_4_ + auVar188._0_4_ + auVar72._0_4_ + auVar114._0_4_ + auVar111._0_4_ + 0.0;
        auVar73._4_4_ =
             auVar70._4_4_ + auVar188._4_4_ + auVar72._4_4_ + auVar114._4_4_ + auVar111._4_4_ + 0.0;
        auVar73._8_4_ =
             auVar70._8_4_ + auVar188._8_4_ + auVar72._8_4_ + auVar114._8_4_ + auVar111._8_4_ + 0.0;
        auVar73._12_4_ =
             auVar70._12_4_ + auVar188._12_4_ + auVar72._12_4_ + auVar114._12_4_ + auVar111._12_4_ +
             0.0;
        auVar122 = auVar73;
        if (iVar25 - 1U < 6) {
          auVar114 = auVar65._0_16_;
          auVar122 = vmaxps_avx(auVar114,auVar73);
          auVar111 = auVar342._0_16_;
          auVar70 = auVar218._0_16_;
          fVar42 = auVar342._0_4_;
          fVar67 = auVar342._4_4_;
          fVar3 = auVar342._8_4_;
          fVar157 = auVar342._12_4_;
          switch(iVar25) {
          case 2:
            auVar70 = vminps_avx(auVar114,auVar73);
            uVar2 = *(this->super_InnerProduct).activation_params.data;
            auVar158._4_4_ = uVar2;
            auVar158._0_4_ = uVar2;
            auVar158._8_4_ = uVar2;
            auVar158._12_4_ = uVar2;
            auVar122 = vfmadd231ps_fma(auVar122,auVar70,auVar158);
            break;
          case 3:
            puVar9 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar9;
            auVar116._4_4_ = uVar2;
            auVar116._0_4_ = uVar2;
            auVar116._8_4_ = uVar2;
            auVar116._12_4_ = uVar2;
            uVar2 = puVar9[1];
            auVar164._4_4_ = uVar2;
            auVar164._0_4_ = uVar2;
            auVar164._8_4_ = uVar2;
            auVar164._12_4_ = uVar2;
            auVar70 = vmaxps_avx(auVar73,auVar116);
            auVar122 = vminps_avx(auVar70,auVar164);
            break;
          case 4:
            uVar36 = CONCAT44(auVar73._4_4_,auVar73._0_4_);
            auVar74._0_8_ = uVar36 ^ 0x8000000080000000;
            auVar74._8_4_ = -auVar73._8_4_;
            auVar74._12_4_ = -auVar73._12_4_;
            auVar117._8_4_ = 0x42b0c0a5;
            auVar117._0_8_ = 0x42b0c0a542b0c0a5;
            auVar117._12_4_ = 0x42b0c0a5;
            auVar114 = vminps_avx(auVar74,auVar117);
            auVar118._8_4_ = 0xc2b0c0a5;
            auVar118._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar118._12_4_ = 0xc2b0c0a5;
            auVar72 = vmaxps_avx(auVar114,auVar118);
            auVar119._8_4_ = 0x3fb8aa3b;
            auVar119._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar119._12_4_ = 0x3fb8aa3b;
            auVar114 = vfmadd213ps_fma(auVar119,auVar72,auVar70);
            auVar165._0_4_ = (int)auVar114._0_4_;
            auVar165._4_4_ = (int)auVar114._4_4_;
            auVar165._8_4_ = (int)auVar114._8_4_;
            auVar165._12_4_ = (int)auVar114._12_4_;
            auVar188 = vcvtdq2ps_avx(auVar165);
            auVar114 = vcmpps_avx(auVar114,auVar188,1);
            auVar114 = vandps_avx(auVar114,auVar111);
            auVar114 = vsubps_avx(auVar188,auVar114);
            auVar166._8_4_ = 0x3f318000;
            auVar166._0_8_ = 0x3f3180003f318000;
            auVar166._12_4_ = 0x3f318000;
            auVar188 = vfmsub231ps_fma(auVar72,auVar114,auVar166);
            auVar167._8_4_ = 0x395e8083;
            auVar167._0_8_ = 0x395e8083395e8083;
            auVar167._12_4_ = 0x395e8083;
            auVar72 = vfmsub231ps_fma(auVar188,auVar114,auVar167);
            auVar168._0_4_ = auVar72._0_4_ * auVar72._0_4_;
            auVar168._4_4_ = auVar72._4_4_ * auVar72._4_4_;
            auVar168._8_4_ = auVar72._8_4_ * auVar72._8_4_;
            auVar168._12_4_ = auVar72._12_4_ * auVar72._12_4_;
            auVar192._8_4_ = 0x39506967;
            auVar192._0_8_ = 0x3950696739506967;
            auVar192._12_4_ = 0x39506967;
            auVar248._8_4_ = 0x3ab743ce;
            auVar248._0_8_ = 0x3ab743ce3ab743ce;
            auVar248._12_4_ = 0x3ab743ce;
            auVar188 = vfmadd213ps_fma(auVar192,auVar72,auVar248);
            auVar249._8_4_ = 0x3c088908;
            auVar249._0_8_ = 0x3c0889083c088908;
            auVar249._12_4_ = 0x3c088908;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar249);
            auVar236._8_4_ = 0x3d2aa9c1;
            auVar236._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar236._12_4_ = 0x3d2aa9c1;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar236);
            auVar237._8_4_ = 0x3e2aaaaa;
            auVar237._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar237._12_4_ = 0x3e2aaaaa;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar237);
            auVar70 = vfmadd213ps_fma(auVar188,auVar72,auVar70);
            auVar70 = vfmadd213ps_fma(auVar70,auVar168,auVar72);
            auVar75._0_4_ = auVar70._0_4_ + fVar42;
            auVar75._4_4_ = auVar70._4_4_ + fVar67;
            auVar75._8_4_ = auVar70._8_4_ + fVar3;
            auVar75._12_4_ = auVar70._12_4_ + fVar157;
            auVar120._0_4_ = (int)auVar114._0_4_;
            auVar120._4_4_ = (int)auVar114._4_4_;
            auVar120._8_4_ = (int)auVar114._8_4_;
            auVar120._12_4_ = (int)auVar114._12_4_;
            auVar70 = vpslld_avx(auVar120,0x17);
            auVar70 = vpaddd_avx(auVar70,auVar111);
            auVar70 = vfmadd213ps_fma(auVar70,auVar75,auVar111);
            auVar122 = vdivps_avx(auVar111,auVar70);
            break;
          case 5:
            auVar319._8_4_ = 0x42b0c0a5;
            auVar319._0_8_ = 0x42b0c0a542b0c0a5;
            auVar319._12_4_ = 0x42b0c0a5;
            auVar114 = vminps_avx(auVar319,auVar73);
            auVar328._8_4_ = 0xc2b0c0a5;
            auVar328._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar328._12_4_ = 0xc2b0c0a5;
            auVar72 = vmaxps_avx(auVar328,auVar114);
            auVar338._8_4_ = 0x3fb8aa3b;
            auVar338._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar338._12_4_ = 0x3fb8aa3b;
            auVar114 = vfmadd213ps_fma(auVar338,auVar72,auVar70);
            auVar185._0_4_ = (int)auVar114._0_4_;
            auVar185._4_4_ = (int)auVar114._4_4_;
            auVar185._8_4_ = (int)auVar114._8_4_;
            auVar185._12_4_ = (int)auVar114._12_4_;
            auVar188 = vcvtdq2ps_avx(auVar185);
            auVar114 = vcmpps_avx(auVar114,auVar188,1);
            auVar114 = vandps_avx(auVar114,auVar111);
            auVar114 = vsubps_avx(auVar188,auVar114);
            auVar203._8_4_ = 0x3f318000;
            auVar203._0_8_ = 0x3f3180003f318000;
            auVar203._12_4_ = 0x3f318000;
            auVar188 = vfmsub231ps_fma(auVar72,auVar114,auVar203);
            auVar219._8_4_ = 0xb95e8083;
            auVar219._0_8_ = 0xb95e8083b95e8083;
            auVar219._12_4_ = 0xb95e8083;
            auVar72 = vfnmsub231ps_fma(auVar188,auVar114,auVar219);
            auVar186._0_4_ = auVar72._0_4_ * auVar72._0_4_;
            auVar186._4_4_ = auVar72._4_4_ * auVar72._4_4_;
            auVar186._8_4_ = auVar72._8_4_ * auVar72._8_4_;
            auVar186._12_4_ = auVar72._12_4_ * auVar72._12_4_;
            auVar235._8_4_ = 0x39506967;
            auVar235._0_8_ = 0x3950696739506967;
            auVar235._12_4_ = 0x39506967;
            auVar188 = vfmadd213ps_fma(auVar235,auVar72,auVar335);
            auVar300._8_4_ = 0x3c088908;
            auVar300._0_8_ = 0x3c0889083c088908;
            auVar300._12_4_ = 0x3c088908;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar300);
            auVar265._8_4_ = 0x3d2aa9c1;
            auVar265._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar265._12_4_ = 0x3d2aa9c1;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar265);
            auVar266._8_4_ = 0x3e2aaaaa;
            auVar266._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar266._12_4_ = 0x3e2aaaaa;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar266);
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar70);
            auVar188 = vfmadd213ps_fma(auVar188,auVar186,auVar72);
            auVar187._0_4_ = auVar188._0_4_ + fVar42;
            auVar187._4_4_ = auVar188._4_4_ + fVar67;
            auVar187._8_4_ = auVar188._8_4_ + fVar3;
            auVar187._12_4_ = auVar188._12_4_ + fVar157;
            auVar113._0_4_ = (int)auVar114._0_4_;
            auVar113._4_4_ = (int)auVar114._4_4_;
            auVar113._8_4_ = (int)auVar114._8_4_;
            auVar113._12_4_ = (int)auVar114._12_4_;
            auVar114 = vpslld_avx(auVar113,0x17);
            auVar114 = vpaddd_avx(auVar114,auVar111);
            auVar68 = vfmadd213ps_fma(auVar114,auVar187,auVar111);
            auVar159._8_4_ = 0x800000;
            auVar159._0_8_ = 0x80000000800000;
            auVar159._12_4_ = 0x800000;
            auVar114 = vmaxps_avx(auVar68,auVar159);
            auVar188 = vpsrld_avx(auVar114,0x17);
            auVar244._8_4_ = 0xffffff82;
            auVar244._0_8_ = 0xffffff82ffffff82;
            auVar244._12_4_ = 0xffffff82;
            auVar188 = vpaddd_avx(auVar244,auVar188);
            auVar245._8_4_ = 0x807fffff;
            auVar245._0_8_ = 0x807fffff807fffff;
            auVar245._12_4_ = 0x807fffff;
            auVar114 = vandps_avx(auVar245,auVar114);
            auVar48 = vorps_avx(auVar70,auVar114);
            auVar72 = vcvtdq2ps_avx(auVar188);
            auVar246._8_4_ = 0x3f3504f3;
            auVar246._0_8_ = 0x3f3504f33f3504f3;
            auVar246._12_4_ = 0x3f3504f3;
            auVar188 = vcmpps_avx(auVar48,auVar246,1);
            auVar114 = vandps_avx(auVar188,auVar48);
            auVar160._0_4_ = auVar114._0_4_ + auVar48._0_4_ + -1.0;
            auVar160._4_4_ = auVar114._4_4_ + auVar48._4_4_ + -1.0;
            auVar160._8_4_ = auVar114._8_4_ + auVar48._8_4_ + -1.0;
            auVar160._12_4_ = auVar114._12_4_ + auVar48._12_4_ + -1.0;
            auVar114 = vandps_avx(auVar188,auVar111);
            auVar188 = vsubps_avx(auVar72,auVar114);
            auVar247._0_4_ = auVar160._0_4_ * auVar160._0_4_;
            auVar247._4_4_ = auVar160._4_4_ * auVar160._4_4_;
            auVar247._8_4_ = auVar160._8_4_ * auVar160._8_4_;
            auVar247._12_4_ = auVar160._12_4_ * auVar160._12_4_;
            auVar267._8_4_ = 0x3d9021bb;
            auVar267._0_8_ = 0x3d9021bb3d9021bb;
            auVar267._12_4_ = 0x3d9021bb;
            auVar301._8_4_ = 0xbdebd1b8;
            auVar301._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar301._12_4_ = 0xbdebd1b8;
            auVar114 = vfmadd213ps_fma(auVar267,auVar160,auVar301);
            auVar302._8_4_ = 0x3def251a;
            auVar302._0_8_ = 0x3def251a3def251a;
            auVar302._12_4_ = 0x3def251a;
            auVar114 = vfmadd213ps_fma(auVar114,auVar160,auVar302);
            auVar303._8_4_ = 0xbdfe5d4f;
            auVar303._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar303._12_4_ = 0xbdfe5d4f;
            auVar114 = vfmadd213ps_fma(auVar114,auVar160,auVar303);
            auVar304._8_4_ = 0x3e11e9bf;
            auVar304._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar304._12_4_ = 0x3e11e9bf;
            auVar114 = vfmadd213ps_fma(auVar114,auVar160,auVar304);
            auVar305._8_4_ = 0xbe2aae50;
            auVar305._0_8_ = 0xbe2aae50be2aae50;
            auVar305._12_4_ = 0xbe2aae50;
            auVar114 = vfmadd213ps_fma(auVar114,auVar160,auVar305);
            auVar306._8_4_ = 0x3e4cceac;
            auVar306._0_8_ = 0x3e4cceac3e4cceac;
            auVar306._12_4_ = 0x3e4cceac;
            auVar114 = vfmadd213ps_fma(auVar114,auVar160,auVar306);
            auVar307._8_4_ = 0xbe7ffffc;
            auVar307._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar307._12_4_ = 0xbe7ffffc;
            auVar114 = vfmadd213ps_fma(auVar114,auVar160,auVar307);
            auVar308._8_4_ = 0x3eaaaaaa;
            auVar308._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar308._12_4_ = 0x3eaaaaaa;
            auVar114 = vfmadd213ps_fma(auVar114,auVar160,auVar308);
            auVar268._0_4_ = auVar247._0_4_ * auVar160._0_4_ * auVar114._0_4_;
            auVar268._4_4_ = auVar247._4_4_ * auVar160._4_4_ * auVar114._4_4_;
            auVar268._8_4_ = auVar247._8_4_ * auVar160._8_4_ * auVar114._8_4_;
            auVar268._12_4_ = auVar247._12_4_ * auVar160._12_4_ * auVar114._12_4_;
            auVar114 = vfmadd231ps_fma(auVar268,auVar188,auVar219);
            auVar72 = vfmsub231ps_fma(auVar114,auVar70,auVar247);
            auVar114 = vcmpps_avx(auVar68,_DAT_00538060,2);
            auVar72 = vsubps_avx(auVar72,auVar160);
            auVar188 = vfnmadd231ps_fma(auVar72,auVar203,auVar188);
            auVar161._0_4_ = auVar188._0_4_ + auVar188._0_4_;
            auVar161._4_4_ = auVar188._4_4_ + auVar188._4_4_;
            auVar161._8_4_ = auVar188._8_4_ + auVar188._8_4_;
            auVar161._12_4_ = auVar188._12_4_ + auVar188._12_4_;
            auVar189._8_4_ = 0x7fffffff;
            auVar189._0_8_ = 0x7fffffff7fffffff;
            auVar189._12_4_ = 0x7fffffff;
            auVar114 = vblendvps_avx(auVar161,auVar189,auVar114);
            auVar162._8_4_ = 0x42b0c0a5;
            auVar162._0_8_ = 0x42b0c0a542b0c0a5;
            auVar162._12_4_ = 0x42b0c0a5;
            auVar114 = vminps_avx(auVar114,auVar162);
            auVar72 = vmaxps_avx(auVar328,auVar114);
            auVar114 = vfmadd213ps_fma(auVar338,auVar72,auVar70);
            auVar190._0_4_ = (int)auVar114._0_4_;
            auVar190._4_4_ = (int)auVar114._4_4_;
            auVar190._8_4_ = (int)auVar114._8_4_;
            auVar190._12_4_ = (int)auVar114._12_4_;
            auVar188 = vcvtdq2ps_avx(auVar190);
            auVar114 = vcmpps_avx(auVar114,auVar188,1);
            auVar114 = vandps_avx(auVar114,auVar111);
            auVar114 = vsubps_avx(auVar188,auVar114);
            auVar188 = vfmsub231ps_fma(auVar72,auVar114,auVar203);
            auVar218 = ZEXT1664(auVar70);
            auVar65 = ZEXT864(0);
            auVar72 = vfnmsub231ps_fma(auVar188,auVar114,auVar219);
            auVar342 = ZEXT1664(auVar111);
            auVar191._0_4_ = auVar72._0_4_ * auVar72._0_4_;
            auVar191._4_4_ = auVar72._4_4_ * auVar72._4_4_;
            auVar191._8_4_ = auVar72._8_4_ * auVar72._8_4_;
            auVar191._12_4_ = auVar72._12_4_ * auVar72._12_4_;
            auVar188 = vfmadd213ps_fma(auVar235,auVar72,auVar335);
            auVar44._8_4_ = 0x3c088908;
            auVar44._0_8_ = 0x3c0889083c088908;
            auVar44._12_4_ = 0x3c088908;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar44);
            auVar45._8_4_ = 0x3d2aa9c1;
            auVar45._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar45._12_4_ = 0x3d2aa9c1;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar45);
            auVar46._8_4_ = 0x3e2aaaaa;
            auVar46._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar46._12_4_ = 0x3e2aaaaa;
            auVar188 = vfmadd213ps_fma(auVar188,auVar72,auVar46);
            auVar70 = vfmadd213ps_fma(auVar188,auVar72,auVar70);
            auVar70 = vfmadd213ps_fma(auVar70,auVar191,auVar72);
            auVar115._0_4_ = auVar70._0_4_ + fVar42;
            auVar115._4_4_ = auVar70._4_4_ + fVar67;
            auVar115._8_4_ = auVar70._8_4_ + fVar3;
            auVar115._12_4_ = auVar70._12_4_ + fVar157;
            auVar163._0_4_ = (int)auVar114._0_4_;
            auVar163._4_4_ = (int)auVar114._4_4_;
            auVar163._8_4_ = (int)auVar114._8_4_;
            auVar163._12_4_ = (int)auVar114._12_4_;
            auVar70 = vpslld_avx(auVar163,0x17);
            auVar70 = vpaddd_avx(auVar70,auVar111);
            auVar70 = vfmadd213ps_fma(auVar70,auVar115,auVar111);
            auVar47._8_4_ = 0x40000000;
            auVar47._0_8_ = 0x4000000040000000;
            auVar47._12_4_ = 0x40000000;
            auVar70 = vdivps_avx(auVar47,auVar70);
            auVar122 = vfmsub213ps_fma(auVar70,auVar73,auVar73);
            break;
          case 6:
            puVar9 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar9;
            auVar121._4_4_ = uVar2;
            auVar121._0_4_ = uVar2;
            auVar121._8_4_ = uVar2;
            auVar121._12_4_ = uVar2;
            uVar2 = puVar9[1];
            auVar169._4_4_ = uVar2;
            auVar169._0_4_ = uVar2;
            auVar169._8_4_ = uVar2;
            auVar169._12_4_ = uVar2;
            auVar70 = vfmadd231ps_fma(auVar169,auVar73,auVar121);
            auVar70 = vmaxps_avx(auVar114,auVar70);
            auVar70 = vminps_avx(auVar70,auVar111);
            auVar122._0_4_ = auVar70._0_4_ * auVar73._0_4_;
            auVar122._4_4_ = auVar70._4_4_ * auVar73._4_4_;
            auVar122._8_4_ = auVar70._8_4_ * auVar73._8_4_;
            auVar122._12_4_ = auVar70._12_4_ * auVar73._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar29 * 0x10) = auVar122;
      }
    }
    else {
      local_140 = 0;
      if (iVar39 == 8) {
        local_140 = 0;
        uVar31 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar31 = 0;
        }
        auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar342 = ZEXT1664(ZEXT816(0) << 0x40);
        for (uVar29 = 0; uVar29 != uVar31; uVar29 = uVar29 + 1) {
          auVar70 = ZEXT816(0) << 0x40;
          auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar6 != (void *)0x0) {
            auVar65 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar6 + uVar29 * 0x20));
          }
          pvVar7 = (this->weight_data_tm).data;
          sVar8 = (this->weight_data_tm).elemsize;
          lVar32 = (long)(this->weight_data_tm).w;
          pauVar30 = (undefined1 (*) [32])(uVar29 * lVar32 * sVar8 + (long)pvVar7);
          lVar35 = 0;
          lVar38 = 0;
          auVar68 = ZEXT816(0) << 0x40;
          auVar48 = ZEXT816(0) << 0x40;
          auVar72 = ZEXT816(0) << 0x40;
          auVar188 = ZEXT816(0) << 0x40;
          auVar114 = ZEXT816(0) << 0x40;
          auVar111 = ZEXT816(0) << 0x40;
          iVar39 = 0;
          pauVar28 = (undefined1 (*) [32])local_108._0_8_;
          while( true ) {
            if (iVar34 <= iVar39 + 7) break;
            uVar2 = *(undefined4 *)*pauVar28;
            auVar322._4_4_ = uVar2;
            auVar322._0_4_ = uVar2;
            auVar322._8_4_ = uVar2;
            auVar322._12_4_ = uVar2;
            auVar322._16_4_ = uVar2;
            auVar322._20_4_ = uVar2;
            auVar322._24_4_ = uVar2;
            auVar322._28_4_ = uVar2;
            uVar2 = *(undefined4 *)(*pauVar28 + 4);
            auVar278._4_4_ = uVar2;
            auVar278._0_4_ = uVar2;
            auVar278._8_4_ = uVar2;
            auVar278._12_4_ = uVar2;
            auVar278._16_4_ = uVar2;
            auVar278._20_4_ = uVar2;
            auVar278._24_4_ = uVar2;
            auVar278._28_4_ = uVar2;
            uVar2 = *(undefined4 *)(*pauVar28 + 8);
            auVar330._4_4_ = uVar2;
            auVar330._0_4_ = uVar2;
            auVar330._8_4_ = uVar2;
            auVar330._12_4_ = uVar2;
            auVar330._16_4_ = uVar2;
            auVar330._20_4_ = uVar2;
            auVar330._24_4_ = uVar2;
            auVar330._28_4_ = uVar2;
            uVar2 = *(undefined4 *)(*pauVar28 + 0xc);
            auVar225._4_4_ = uVar2;
            auVar225._0_4_ = uVar2;
            auVar225._8_4_ = uVar2;
            auVar225._12_4_ = uVar2;
            auVar225._16_4_ = uVar2;
            auVar225._20_4_ = uVar2;
            auVar225._24_4_ = uVar2;
            auVar225._28_4_ = uVar2;
            auVar83 = vfmadd231ps_fma(auVar65._0_32_,auVar322,*pauVar30);
            auVar65 = ZEXT1664(auVar83);
            auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar278,pauVar30[1]);
            auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar330,pauVar30[2]);
            auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar225,pauVar30[3]);
            uVar2 = *(undefined4 *)(*pauVar28 + 0x10);
            auVar226._4_4_ = uVar2;
            auVar226._0_4_ = uVar2;
            auVar226._8_4_ = uVar2;
            auVar226._12_4_ = uVar2;
            auVar226._16_4_ = uVar2;
            auVar226._20_4_ = uVar2;
            auVar226._24_4_ = uVar2;
            auVar226._28_4_ = uVar2;
            uVar2 = *(undefined4 *)(*pauVar28 + 0x14);
            auVar279._4_4_ = uVar2;
            auVar279._0_4_ = uVar2;
            auVar279._8_4_ = uVar2;
            auVar279._12_4_ = uVar2;
            auVar279._16_4_ = uVar2;
            auVar279._20_4_ = uVar2;
            auVar279._24_4_ = uVar2;
            auVar279._28_4_ = uVar2;
            uVar2 = *(undefined4 *)(*pauVar28 + 0x18);
            auVar323._4_4_ = uVar2;
            auVar323._0_4_ = uVar2;
            auVar323._8_4_ = uVar2;
            auVar323._12_4_ = uVar2;
            auVar323._16_4_ = uVar2;
            auVar323._20_4_ = uVar2;
            auVar323._24_4_ = uVar2;
            auVar323._28_4_ = uVar2;
            uVar2 = *(undefined4 *)(*pauVar28 + 0x1c);
            auVar331._4_4_ = uVar2;
            auVar331._0_4_ = uVar2;
            auVar331._8_4_ = uVar2;
            auVar331._12_4_ = uVar2;
            auVar331._16_4_ = uVar2;
            auVar331._20_4_ = uVar2;
            auVar331._24_4_ = uVar2;
            auVar331._28_4_ = uVar2;
            auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar226,pauVar30[4]);
            auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar279,pauVar30[5]);
            auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar323,pauVar30[6]);
            auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar331,pauVar30[7]);
            pauVar28 = pauVar28 + 1;
            pauVar30 = pauVar30 + 8;
            iVar39 = iVar39 + 8;
            lVar38 = lVar38 + 0x20;
            lVar35 = lVar35 + 8;
          }
          lVar32 = sVar8 * uVar29 * lVar32;
          for (; iVar39 + 3 < iVar34; iVar39 = iVar39 + 4) {
            uVar2 = *(undefined4 *)((undefined1 *)local_108._0_8_ + lVar38);
            auVar227._4_4_ = uVar2;
            auVar227._0_4_ = uVar2;
            auVar227._8_4_ = uVar2;
            auVar227._12_4_ = uVar2;
            auVar227._16_4_ = uVar2;
            auVar227._20_4_ = uVar2;
            auVar227._24_4_ = uVar2;
            auVar227._28_4_ = uVar2;
            uVar2 = *(undefined4 *)((undefined1 *)local_108._0_8_ + lVar38 + 4);
            auVar280._4_4_ = uVar2;
            auVar280._0_4_ = uVar2;
            auVar280._8_4_ = uVar2;
            auVar280._12_4_ = uVar2;
            auVar280._16_4_ = uVar2;
            auVar280._20_4_ = uVar2;
            auVar280._24_4_ = uVar2;
            auVar280._28_4_ = uVar2;
            uVar2 = *(undefined4 *)((undefined1 *)local_108._0_8_ + lVar38 + 8);
            auVar324._4_4_ = uVar2;
            auVar324._0_4_ = uVar2;
            auVar324._8_4_ = uVar2;
            auVar324._12_4_ = uVar2;
            auVar324._16_4_ = uVar2;
            auVar324._20_4_ = uVar2;
            auVar324._24_4_ = uVar2;
            auVar324._28_4_ = uVar2;
            uVar2 = *(undefined4 *)((undefined1 *)local_108._0_8_ + lVar38 + 0xc);
            auVar332._4_4_ = uVar2;
            auVar332._0_4_ = uVar2;
            auVar332._8_4_ = uVar2;
            auVar332._12_4_ = uVar2;
            auVar332._16_4_ = uVar2;
            auVar332._20_4_ = uVar2;
            auVar332._24_4_ = uVar2;
            auVar332._28_4_ = uVar2;
            auVar83 = vfmadd231ps_fma(auVar65._0_32_,auVar227,
                                      *(undefined1 (*) [32])((long)pvVar7 + lVar38 * 8 + lVar32));
            auVar65 = ZEXT1664(auVar83);
            auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar280,
                                       *(undefined1 (*) [32])
                                        ((long)pvVar7 + lVar38 * 8 + lVar32 + 0x20));
            auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar324,
                                       *(undefined1 (*) [32])
                                        ((long)pvVar7 + lVar38 * 8 + lVar32 + 0x40));
            auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar332,
                                       *(undefined1 (*) [32])
                                        ((long)pvVar7 + lVar38 * 8 + lVar32 + 0x60));
            pauVar30 = pauVar30 + 4;
            lVar38 = lVar38 + 0x10;
            lVar35 = lVar35 + 4;
          }
          for (; (int)lVar35 < iVar34; lVar35 = lVar35 + 1) {
            uVar2 = *(undefined4 *)((undefined1 *)local_108._0_8_ + lVar35 * 4);
            auVar228._4_4_ = uVar2;
            auVar228._0_4_ = uVar2;
            auVar228._8_4_ = uVar2;
            auVar228._12_4_ = uVar2;
            auVar228._16_4_ = uVar2;
            auVar228._20_4_ = uVar2;
            auVar228._24_4_ = uVar2;
            auVar228._28_4_ = uVar2;
            auVar83 = vfmadd231ps_fma(auVar65._0_32_,auVar228,*pauVar30);
            auVar65 = ZEXT1664(auVar83);
            pauVar30 = pauVar30 + 1;
          }
          fVar42 = auVar70._0_4_ + auVar68._0_4_ + auVar48._0_4_ + auVar72._0_4_ +
                   auVar111._0_4_ + auVar188._0_4_ + auVar114._0_4_ + auVar65._0_4_;
          fVar67 = auVar70._4_4_ + auVar68._4_4_ + auVar48._4_4_ + auVar72._4_4_ +
                   auVar111._4_4_ + auVar188._4_4_ + auVar114._4_4_ + auVar65._4_4_;
          auVar49._0_8_ = CONCAT44(fVar67,fVar42);
          auVar49._8_4_ =
               auVar70._8_4_ + auVar68._8_4_ + auVar48._8_4_ + auVar72._8_4_ +
               auVar111._8_4_ + auVar188._8_4_ + auVar114._8_4_ + auVar65._8_4_;
          auVar49._12_4_ =
               auVar70._12_4_ + auVar68._12_4_ + auVar48._12_4_ + auVar72._12_4_ +
               auVar111._12_4_ + auVar188._12_4_ + auVar114._12_4_ + auVar65._12_4_;
          auVar49._16_4_ = auVar65._16_4_ + 0.0;
          auVar49._20_4_ = auVar65._20_4_ + 0.0;
          auVar49._24_4_ = auVar65._24_4_ + 0.0;
          auVar49._28_4_ = auVar65._28_4_ + 0.0;
          auVar64 = auVar49;
          if (5 < iVar25 - 1U) goto switchD_002bcd48_caseD_1;
          auVar51 = auVar342._0_32_;
          auVar64 = vmaxps_avx(auVar51,auVar49);
          auVar341 = auVar218._0_32_;
          fVar3 = auVar218._0_4_;
          fVar157 = auVar218._4_4_;
          fVar12 = auVar218._8_4_;
          fVar13 = auVar218._12_4_;
          fVar14 = auVar218._16_4_;
          fVar15 = auVar218._20_4_;
          fVar16 = auVar218._24_4_;
          fVar17 = auVar218._28_4_;
          switch(iVar25) {
          case 2:
            auVar341 = vminps_avx(auVar51,auVar49);
            uVar2 = *(this->super_InnerProduct).activation_params.data;
            auVar138._4_4_ = uVar2;
            auVar138._0_4_ = uVar2;
            auVar138._8_4_ = uVar2;
            auVar138._12_4_ = uVar2;
            auVar138._16_4_ = uVar2;
            auVar138._20_4_ = uVar2;
            auVar138._24_4_ = uVar2;
            auVar138._28_4_ = uVar2;
            auVar70 = vfmadd231ps_fma(auVar64,auVar341,auVar138);
            auVar64 = ZEXT1632(auVar70);
            break;
          case 3:
            puVar9 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar9;
            auVar90._4_4_ = uVar2;
            auVar90._0_4_ = uVar2;
            auVar90._8_4_ = uVar2;
            auVar90._12_4_ = uVar2;
            auVar90._16_4_ = uVar2;
            auVar90._20_4_ = uVar2;
            auVar90._24_4_ = uVar2;
            auVar90._28_4_ = uVar2;
            uVar2 = puVar9[1];
            auVar147._4_4_ = uVar2;
            auVar147._0_4_ = uVar2;
            auVar147._8_4_ = uVar2;
            auVar147._12_4_ = uVar2;
            auVar147._16_4_ = uVar2;
            auVar147._20_4_ = uVar2;
            auVar147._24_4_ = uVar2;
            auVar147._28_4_ = uVar2;
            auVar64 = vmaxps_avx(auVar49,auVar90);
            auVar64 = vminps_avx(auVar64,auVar147);
            break;
          case 4:
            auVar50._0_8_ = auVar49._0_8_ ^ 0x8000000080000000;
            auVar50._8_4_ = -auVar49._8_4_;
            auVar50._12_4_ = -auVar49._12_4_;
            auVar50._16_4_ = -auVar49._16_4_;
            auVar50._20_4_ = -auVar49._20_4_;
            auVar50._24_4_ = -auVar49._24_4_;
            auVar50._28_4_ = -auVar49._28_4_;
            auVar91._8_4_ = 0x42b0c0a5;
            auVar91._0_8_ = 0x42b0c0a542b0c0a5;
            auVar91._12_4_ = 0x42b0c0a5;
            auVar91._16_4_ = 0x42b0c0a5;
            auVar91._20_4_ = 0x42b0c0a5;
            auVar91._24_4_ = 0x42b0c0a5;
            auVar91._28_4_ = 0x42b0c0a5;
            auVar64 = vminps_avx(auVar50,auVar91);
            auVar92._8_4_ = 0xc2b0c0a5;
            auVar92._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar92._12_4_ = 0xc2b0c0a5;
            auVar92._16_4_ = 0xc2b0c0a5;
            auVar92._20_4_ = 0xc2b0c0a5;
            auVar92._24_4_ = 0xc2b0c0a5;
            auVar92._28_4_ = 0xc2b0c0a5;
            auVar51 = vmaxps_avx(auVar64,auVar92);
            auVar93._8_4_ = 0x3fb8aa3b;
            auVar93._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar93._12_4_ = 0x3fb8aa3b;
            auVar93._16_4_ = 0x3fb8aa3b;
            auVar93._20_4_ = 0x3fb8aa3b;
            auVar93._24_4_ = 0x3fb8aa3b;
            auVar93._28_4_ = 0x3fb8aa3b;
            auVar241._8_4_ = 0x3f000000;
            auVar241._0_8_ = 0x3f0000003f000000;
            auVar241._12_4_ = 0x3f000000;
            auVar241._16_4_ = 0x3f000000;
            auVar241._20_4_ = 0x3f000000;
            auVar241._24_4_ = 0x3f000000;
            auVar241._28_4_ = 0x3f000000;
            auVar70 = vfmadd213ps_fma(auVar93,auVar51,auVar241);
            auVar54 = vroundps_avx(ZEXT1632(auVar70),1);
            auVar64 = vcmpps_avx(ZEXT1632(auVar70),auVar54,1);
            auVar64 = vandps_avx(auVar64,auVar341);
            auVar64 = vsubps_avx(auVar54,auVar64);
            auVar148._8_4_ = 0x3f318000;
            auVar148._0_8_ = 0x3f3180003f318000;
            auVar148._12_4_ = 0x3f318000;
            auVar148._16_4_ = 0x3f318000;
            auVar148._20_4_ = 0x3f318000;
            auVar148._24_4_ = 0x3f318000;
            auVar148._28_4_ = 0x3f318000;
            auVar70 = vfmsub231ps_fma(auVar51,auVar64,auVar148);
            auVar149._8_4_ = 0x395e8083;
            auVar149._0_8_ = 0x395e8083395e8083;
            auVar149._12_4_ = 0x395e8083;
            auVar149._16_4_ = 0x395e8083;
            auVar149._20_4_ = 0x395e8083;
            auVar149._24_4_ = 0x395e8083;
            auVar149._28_4_ = 0x395e8083;
            auVar111 = vfmsub231ps_fma(ZEXT1632(auVar70),auVar64,auVar149);
            auVar51 = ZEXT1632(auVar111);
            auVar20._28_4_ = 0x395e8083;
            auVar20._0_28_ =
                 ZEXT1628(CONCAT412(auVar111._12_4_ * auVar111._12_4_,
                                    CONCAT48(auVar111._8_4_ * auVar111._8_4_,
                                             CONCAT44(auVar111._4_4_ * auVar111._4_4_,
                                                      auVar111._0_4_ * auVar111._0_4_))));
            auVar197._8_4_ = 0x39506967;
            auVar197._0_8_ = 0x3950696739506967;
            auVar197._12_4_ = 0x39506967;
            auVar197._16_4_ = 0x39506967;
            auVar197._20_4_ = 0x39506967;
            auVar197._24_4_ = 0x39506967;
            auVar197._28_4_ = 0x39506967;
            auVar232._8_4_ = 0x3ab743ce;
            auVar232._0_8_ = 0x3ab743ce3ab743ce;
            auVar232._12_4_ = 0x3ab743ce;
            auVar232._16_4_ = 0x3ab743ce;
            auVar232._20_4_ = 0x3ab743ce;
            auVar232._24_4_ = 0x3ab743ce;
            auVar232._28_4_ = 0x3ab743ce;
            auVar70 = vfmadd213ps_fma(auVar197,auVar51,auVar232);
            auVar177._8_4_ = 0x3c088908;
            auVar177._0_8_ = 0x3c0889083c088908;
            auVar177._12_4_ = 0x3c088908;
            auVar177._16_4_ = 0x3c088908;
            auVar177._20_4_ = 0x3c088908;
            auVar177._24_4_ = 0x3c088908;
            auVar177._28_4_ = 0x3c088908;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar177);
            auVar178._8_4_ = 0x3d2aa9c1;
            auVar178._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar178._12_4_ = 0x3d2aa9c1;
            auVar178._16_4_ = 0x3d2aa9c1;
            auVar178._20_4_ = 0x3d2aa9c1;
            auVar178._24_4_ = 0x3d2aa9c1;
            auVar178._28_4_ = 0x3d2aa9c1;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar178);
            auVar179._8_4_ = 0x3e2aaaaa;
            auVar179._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar179._12_4_ = 0x3e2aaaaa;
            auVar179._16_4_ = 0x3e2aaaaa;
            auVar179._20_4_ = 0x3e2aaaaa;
            auVar179._24_4_ = 0x3e2aaaaa;
            auVar179._28_4_ = 0x3e2aaaaa;
            auVar51 = ZEXT1632(auVar111);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar179);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar241);
            auVar114 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar20,auVar51);
            auVar43._0_4_ = (int)auVar64._0_4_;
            auVar43._4_4_ = (int)auVar64._4_4_;
            auVar43._8_4_ = (int)auVar64._8_4_;
            auVar43._12_4_ = (int)auVar64._12_4_;
            auVar52._16_4_ = (int)auVar64._16_4_;
            auVar52._0_16_ = auVar43;
            auVar52._20_4_ = (int)auVar64._20_4_;
            auVar52._24_4_ = (int)auVar64._24_4_;
            auVar52._28_4_ = (int)auVar64._28_4_;
            auVar111 = vpslld_avx(auVar43,0x17);
            auVar70 = vpslld_avx(auVar52._16_16_,0x17);
            auVar112._8_4_ = 0x3f800000;
            auVar112._0_8_ = 0x3f8000003f800000;
            auVar112._12_4_ = 0x3f800000;
            auVar70 = vpaddd_avx(auVar70,auVar112);
            auVar111 = vpaddd_avx(auVar111,auVar112);
            auVar53._16_16_ = auVar70;
            auVar53._0_16_ = auVar111;
            auVar94._0_4_ = auVar114._0_4_ + fVar3;
            auVar94._4_4_ = auVar114._4_4_ + fVar157;
            auVar94._8_4_ = auVar114._8_4_ + fVar12;
            auVar94._12_4_ = auVar114._12_4_ + fVar13;
            auVar94._16_4_ = fVar14 + 0.0;
            auVar94._20_4_ = fVar15 + 0.0;
            auVar94._24_4_ = fVar16 + 0.0;
            auVar94._28_4_ = fVar17 + 0.0;
            auVar70 = vfmadd213ps_fma(auVar53,auVar94,auVar341);
            auVar64 = vdivps_avx(auVar341,ZEXT1632(auVar70));
            break;
          case 5:
            auVar311._8_4_ = 0x42b0c0a5;
            auVar311._0_8_ = 0x42b0c0a542b0c0a5;
            auVar311._12_4_ = 0x42b0c0a5;
            auVar311._16_4_ = 0x42b0c0a5;
            auVar311._20_4_ = 0x42b0c0a5;
            auVar311._24_4_ = 0x42b0c0a5;
            auVar311._28_4_ = 0x42b0c0a5;
            auVar64 = vminps_avx(auVar311,auVar49);
            auVar313._8_4_ = 0xc2b0c0a5;
            auVar313._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar313._12_4_ = 0xc2b0c0a5;
            auVar313._16_4_ = 0xc2b0c0a5;
            auVar313._20_4_ = 0xc2b0c0a5;
            auVar313._24_4_ = 0xc2b0c0a5;
            auVar313._28_4_ = 0xc2b0c0a5;
            auVar51 = vmaxps_avx(auVar313,auVar64);
            auVar139._8_4_ = 0x3fb8aa3b;
            auVar139._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar139._12_4_ = 0x3fb8aa3b;
            auVar139._16_4_ = 0x3fb8aa3b;
            auVar139._20_4_ = 0x3fb8aa3b;
            auVar139._24_4_ = 0x3fb8aa3b;
            auVar139._28_4_ = 0x3fb8aa3b;
            auVar340._8_4_ = 0x3f000000;
            auVar340._0_8_ = 0x3f0000003f000000;
            auVar340._12_4_ = 0x3f000000;
            auVar340._16_4_ = 0x3f000000;
            auVar340._20_4_ = 0x3f000000;
            auVar340._24_4_ = 0x3f000000;
            auVar340._28_4_ = 0x3f000000;
            auVar70 = vfmadd213ps_fma(auVar139,auVar51,auVar340);
            auVar54 = vroundps_avx(ZEXT1632(auVar70),1);
            auVar64 = vcmpps_avx(ZEXT1632(auVar70),auVar54,1);
            auVar64 = vandps_avx(auVar64,auVar341);
            auVar64 = vsubps_avx(auVar54,auVar64);
            auVar333._8_4_ = 0x3f318000;
            auVar333._0_8_ = 0x3f3180003f318000;
            auVar333._12_4_ = 0x3f318000;
            auVar333._16_4_ = 0x3f318000;
            auVar333._20_4_ = 0x3f318000;
            auVar333._24_4_ = 0x3f318000;
            auVar333._28_4_ = 0x3f318000;
            auVar70 = vfmsub231ps_fma(auVar51,auVar64,auVar333);
            auVar314._8_4_ = 0xb95e8083;
            auVar314._0_8_ = 0xb95e8083b95e8083;
            auVar314._12_4_ = 0xb95e8083;
            auVar314._16_4_ = 0xb95e8083;
            auVar314._20_4_ = 0xb95e8083;
            auVar314._24_4_ = 0xb95e8083;
            auVar314._28_4_ = 0xb95e8083;
            auVar111 = vfnmsub231ps_fma(ZEXT1632(auVar70),auVar64,auVar314);
            auVar51 = ZEXT1632(auVar111);
            auVar18._28_4_ = auVar54._28_4_;
            auVar18._0_28_ =
                 ZEXT1628(CONCAT412(auVar111._12_4_ * auVar111._12_4_,
                                    CONCAT48(auVar111._8_4_ * auVar111._8_4_,
                                             CONCAT44(auVar111._4_4_ * auVar111._4_4_,
                                                      auVar111._0_4_ * auVar111._0_4_))));
            auVar229._8_4_ = 0x39506967;
            auVar229._0_8_ = 0x3950696739506967;
            auVar229._12_4_ = 0x39506967;
            auVar229._16_4_ = 0x39506967;
            auVar229._20_4_ = 0x39506967;
            auVar229._24_4_ = 0x39506967;
            auVar229._28_4_ = 0x39506967;
            auVar336._8_4_ = 0x3ab743ce;
            auVar336._0_8_ = 0x3ab743ce3ab743ce;
            auVar336._12_4_ = 0x3ab743ce;
            auVar336._16_4_ = 0x3ab743ce;
            auVar336._20_4_ = 0x3ab743ce;
            auVar336._24_4_ = 0x3ab743ce;
            auVar336._28_4_ = 0x3ab743ce;
            auVar70 = vfmadd213ps_fma(auVar229,auVar51,auVar336);
            auVar176._8_4_ = 0x3c088908;
            auVar176._0_8_ = 0x3c0889083c088908;
            auVar176._12_4_ = 0x3c088908;
            auVar176._16_4_ = 0x3c088908;
            auVar176._20_4_ = 0x3c088908;
            auVar176._24_4_ = 0x3c088908;
            auVar176._28_4_ = 0x3c088908;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar176);
            auVar214._8_4_ = 0x3d2aa9c1;
            auVar214._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar214._12_4_ = 0x3d2aa9c1;
            auVar214._16_4_ = 0x3d2aa9c1;
            auVar214._20_4_ = 0x3d2aa9c1;
            auVar214._24_4_ = 0x3d2aa9c1;
            auVar214._28_4_ = 0x3d2aa9c1;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar214);
            auVar325._8_4_ = 0x3e2aaaaa;
            auVar325._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar325._12_4_ = 0x3e2aaaaa;
            auVar325._16_4_ = 0x3e2aaaaa;
            auVar325._20_4_ = 0x3e2aaaaa;
            auVar325._24_4_ = 0x3e2aaaaa;
            auVar325._28_4_ = 0x3e2aaaaa;
            auVar51 = ZEXT1632(auVar111);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar325);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar340);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar18,auVar51);
            auVar194._0_4_ = auVar70._0_4_ + fVar3;
            auVar194._4_4_ = auVar70._4_4_ + fVar157;
            auVar194._8_4_ = auVar70._8_4_ + fVar12;
            auVar194._12_4_ = auVar70._12_4_ + fVar13;
            auVar194._16_4_ = fVar14 + 0.0;
            auVar194._20_4_ = fVar15 + 0.0;
            auVar194._24_4_ = fVar16 + 0.0;
            auVar194._28_4_ = fVar17 + 0.0;
            auVar69._0_4_ = (int)auVar64._0_4_;
            auVar69._4_4_ = (int)auVar64._4_4_;
            auVar69._8_4_ = (int)auVar64._8_4_;
            auVar69._12_4_ = (int)auVar64._12_4_;
            auVar86._16_4_ = (int)auVar64._16_4_;
            auVar86._0_16_ = auVar69;
            auVar86._20_4_ = (int)auVar64._20_4_;
            auVar86._24_4_ = (int)auVar64._24_4_;
            auVar86._28_4_ = (int)auVar64._28_4_;
            auVar111 = vpslld_avx(auVar69,0x17);
            auVar70 = vpslld_avx(auVar86._16_16_,0x17);
            auVar234._8_4_ = 0x3f800000;
            auVar234._0_8_ = 0x3f8000003f800000;
            auVar234._12_4_ = 0x3f800000;
            auVar70 = vpaddd_avx(auVar70,auVar234);
            auVar111 = vpaddd_avx(auVar111,auVar234);
            auVar87._16_16_ = auVar70;
            auVar87._0_16_ = auVar111;
            auVar114 = vfmadd213ps_fma(auVar87,auVar194,auVar341);
            auVar140._8_4_ = 0x800000;
            auVar140._0_8_ = 0x80000000800000;
            auVar140._12_4_ = 0x800000;
            auVar140._16_4_ = 0x800000;
            auVar140._20_4_ = 0x800000;
            auVar140._24_4_ = 0x800000;
            auVar140._28_4_ = 0x800000;
            auVar64 = vmaxps_avx(ZEXT1632(auVar114),auVar140);
            auVar111 = vpsrld_avx(auVar64._0_16_,0x17);
            auVar70 = vpsrld_avx(auVar64._16_16_,0x17);
            auVar254._8_4_ = 0x807fffff;
            auVar254._0_8_ = 0x807fffff807fffff;
            auVar254._12_4_ = 0x807fffff;
            auVar254._16_4_ = 0x807fffff;
            auVar254._20_4_ = 0x807fffff;
            auVar254._24_4_ = 0x807fffff;
            auVar254._28_4_ = 0x807fffff;
            auVar64 = vandps_avx(auVar254,auVar64);
            auVar54 = vorps_avx(auVar340,auVar64);
            auVar255._8_4_ = 0x3f3504f3;
            auVar255._0_8_ = 0x3f3504f33f3504f3;
            auVar255._12_4_ = 0x3f3504f3;
            auVar255._16_4_ = 0x3f3504f3;
            auVar255._20_4_ = 0x3f3504f3;
            auVar255._24_4_ = 0x3f3504f3;
            auVar255._28_4_ = 0x3f3504f3;
            auVar51 = vcmpps_avx(auVar255,auVar54,2);
            auVar64 = vandnps_avx(auVar51,auVar54);
            auVar312._8_4_ = 0xbf800000;
            auVar312._0_8_ = 0xbf800000bf800000;
            auVar312._12_4_ = 0xbf800000;
            auVar312._16_4_ = 0xbf800000;
            auVar312._20_4_ = 0xbf800000;
            auVar312._24_4_ = 0xbf800000;
            auVar312._28_4_ = 0xbf800000;
            auVar141._0_4_ = auVar64._0_4_ + auVar54._0_4_ + -1.0;
            auVar141._4_4_ = auVar64._4_4_ + auVar54._4_4_ + -1.0;
            auVar141._8_4_ = auVar64._8_4_ + auVar54._8_4_ + -1.0;
            auVar141._12_4_ = auVar64._12_4_ + auVar54._12_4_ + -1.0;
            auVar141._16_4_ = auVar64._16_4_ + auVar54._16_4_ + -1.0;
            auVar141._20_4_ = auVar64._20_4_ + auVar54._20_4_ + -1.0;
            auVar141._24_4_ = auVar64._24_4_ + auVar54._24_4_ + -1.0;
            auVar141._28_4_ = auVar64._28_4_ + auVar54._28_4_ + -1.0;
            auVar70 = vpsubd_avx(auVar70,auVar51._16_16_);
            auVar264._8_4_ = 0xffffff81;
            auVar264._0_8_ = 0xffffff81ffffff81;
            auVar264._12_4_ = 0xffffff81;
            auVar70 = vpaddd_avx(auVar264,auVar70);
            auVar111 = vpsubd_avx(auVar111,auVar51._0_16_);
            auVar111 = vpaddd_avx(auVar264,auVar111);
            auVar195._16_16_ = auVar70;
            auVar195._0_16_ = auVar111;
            auVar230._0_4_ = auVar141._0_4_ * auVar141._0_4_;
            auVar230._4_4_ = auVar141._4_4_ * auVar141._4_4_;
            auVar230._8_4_ = auVar141._8_4_ * auVar141._8_4_;
            auVar230._12_4_ = auVar141._12_4_ * auVar141._12_4_;
            auVar230._16_4_ = auVar141._16_4_ * auVar141._16_4_;
            auVar230._20_4_ = auVar141._20_4_ * auVar141._20_4_;
            auVar230._24_4_ = auVar141._24_4_ * auVar141._24_4_;
            auVar230._28_4_ = 0;
            auVar256._8_4_ = 0x3d9021bb;
            auVar256._0_8_ = 0x3d9021bb3d9021bb;
            auVar256._12_4_ = 0x3d9021bb;
            auVar256._16_4_ = 0x3d9021bb;
            auVar256._20_4_ = 0x3d9021bb;
            auVar256._24_4_ = 0x3d9021bb;
            auVar256._28_4_ = 0x3d9021bb;
            auVar281._8_4_ = 0xbdebd1b8;
            auVar281._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar281._12_4_ = 0xbdebd1b8;
            auVar281._16_4_ = 0xbdebd1b8;
            auVar281._20_4_ = 0xbdebd1b8;
            auVar281._24_4_ = 0xbdebd1b8;
            auVar281._28_4_ = 0xbdebd1b8;
            auVar70 = vfmadd213ps_fma(auVar256,auVar141,auVar281);
            auVar282._8_4_ = 0x3def251a;
            auVar282._0_8_ = 0x3def251a3def251a;
            auVar282._12_4_ = 0x3def251a;
            auVar282._16_4_ = 0x3def251a;
            auVar282._20_4_ = 0x3def251a;
            auVar282._24_4_ = 0x3def251a;
            auVar282._28_4_ = 0x3def251a;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar141,auVar282);
            auVar283._8_4_ = 0xbdfe5d4f;
            auVar283._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar283._12_4_ = 0xbdfe5d4f;
            auVar283._16_4_ = 0xbdfe5d4f;
            auVar283._20_4_ = 0xbdfe5d4f;
            auVar283._24_4_ = 0xbdfe5d4f;
            auVar283._28_4_ = 0xbdfe5d4f;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar141,auVar283);
            auVar284._8_4_ = 0x3e11e9bf;
            auVar284._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar284._12_4_ = 0x3e11e9bf;
            auVar284._16_4_ = 0x3e11e9bf;
            auVar284._20_4_ = 0x3e11e9bf;
            auVar284._24_4_ = 0x3e11e9bf;
            auVar284._28_4_ = 0x3e11e9bf;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar141,auVar284);
            auVar285._8_4_ = 0xbe2aae50;
            auVar285._0_8_ = 0xbe2aae50be2aae50;
            auVar285._12_4_ = 0xbe2aae50;
            auVar285._16_4_ = 0xbe2aae50;
            auVar285._20_4_ = 0xbe2aae50;
            auVar285._24_4_ = 0xbe2aae50;
            auVar285._28_4_ = 0xbe2aae50;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar141,auVar285);
            auVar286._8_4_ = 0x3e4cceac;
            auVar286._0_8_ = 0x3e4cceac3e4cceac;
            auVar286._12_4_ = 0x3e4cceac;
            auVar286._16_4_ = 0x3e4cceac;
            auVar286._20_4_ = 0x3e4cceac;
            auVar286._24_4_ = 0x3e4cceac;
            auVar286._28_4_ = 0x3e4cceac;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar141,auVar286);
            auVar287._8_4_ = 0xbe7ffffc;
            auVar287._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar287._12_4_ = 0xbe7ffffc;
            auVar287._16_4_ = 0xbe7ffffc;
            auVar287._20_4_ = 0xbe7ffffc;
            auVar287._24_4_ = 0xbe7ffffc;
            auVar287._28_4_ = 0xbe7ffffc;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar141,auVar287);
            auVar288._8_4_ = 0x3eaaaaaa;
            auVar288._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar288._12_4_ = 0x3eaaaaaa;
            auVar288._16_4_ = 0x3eaaaaaa;
            auVar288._20_4_ = 0x3eaaaaaa;
            auVar288._24_4_ = 0x3eaaaaaa;
            auVar288._28_4_ = 0x3eaaaaaa;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar141,auVar288);
            auVar257._0_4_ = auVar230._0_4_ * auVar141._0_4_ * auVar70._0_4_;
            auVar257._4_4_ = auVar230._4_4_ * auVar141._4_4_ * auVar70._4_4_;
            auVar257._8_4_ = auVar230._8_4_ * auVar141._8_4_ * auVar70._8_4_;
            auVar257._12_4_ = auVar230._12_4_ * auVar141._12_4_ * auVar70._12_4_;
            auVar257._16_4_ = auVar230._16_4_ * auVar141._16_4_ * 0.0;
            auVar257._20_4_ = auVar230._20_4_ * auVar141._20_4_ * 0.0;
            auVar257._24_4_ = auVar230._24_4_ * auVar141._24_4_ * 0.0;
            auVar257._28_4_ = 0;
            auVar51 = vcvtdq2ps_avx(auVar195);
            auVar70 = vfmadd231ps_fma(auVar257,auVar51,auVar314);
            auVar70 = vfmsub231ps_fma(ZEXT1632(auVar70),auVar340,auVar230);
            auVar64 = vcmpps_avx(ZEXT1632(auVar114),_DAT_0053be40,2);
            auVar54 = vsubps_avx(ZEXT1632(auVar70),auVar141);
            auVar70 = vfmsub231ps_fma(auVar54,auVar333,auVar51);
            auVar289._8_4_ = 0xc0000000;
            auVar289._0_8_ = 0xc0000000c0000000;
            auVar289._12_4_ = 0xc0000000;
            auVar289._16_4_ = 0xc0000000;
            auVar289._20_4_ = 0xc0000000;
            auVar289._24_4_ = 0xc0000000;
            auVar289._28_4_ = 0xc0000000;
            auVar142._0_4_ = auVar70._0_4_ * -2.0;
            auVar142._4_4_ = auVar70._4_4_ * -2.0;
            auVar142._8_4_ = auVar70._8_4_ * -2.0;
            auVar142._12_4_ = auVar70._12_4_ * -2.0;
            auVar142._16_4_ = 0x80000000;
            auVar142._20_4_ = 0x80000000;
            auVar142._24_4_ = 0x80000000;
            auVar142._28_4_ = 0;
            auVar196._8_4_ = 0x7fffffff;
            auVar196._0_8_ = 0x7fffffff7fffffff;
            auVar196._12_4_ = 0x7fffffff;
            auVar196._16_4_ = 0x7fffffff;
            auVar196._20_4_ = 0x7fffffff;
            auVar196._24_4_ = 0x7fffffff;
            auVar196._28_4_ = 0x7fffffff;
            auVar64 = vblendvps_avx(auVar142,auVar196,auVar64);
            auVar143._8_4_ = 0x42b0c0a5;
            auVar143._0_8_ = 0x42b0c0a542b0c0a5;
            auVar143._12_4_ = 0x42b0c0a5;
            auVar143._16_4_ = 0x42b0c0a5;
            auVar143._20_4_ = 0x42b0c0a5;
            auVar143._24_4_ = 0x42b0c0a5;
            auVar143._28_4_ = 0x42b0c0a5;
            auVar64 = vminps_avx(auVar64,auVar143);
            auVar144._8_4_ = 0xc2b0c0a5;
            auVar144._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar144._12_4_ = 0xc2b0c0a5;
            auVar144._16_4_ = 0xc2b0c0a5;
            auVar144._20_4_ = 0xc2b0c0a5;
            auVar144._24_4_ = 0xc2b0c0a5;
            auVar144._28_4_ = 0xc2b0c0a5;
            auVar51 = vmaxps_avx(auVar64,auVar144);
            auVar145._8_4_ = 0x3fb8aa3b;
            auVar145._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar145._12_4_ = 0x3fb8aa3b;
            auVar145._16_4_ = 0x3fb8aa3b;
            auVar145._20_4_ = 0x3fb8aa3b;
            auVar145._24_4_ = 0x3fb8aa3b;
            auVar145._28_4_ = 0x3fb8aa3b;
            auVar70 = vfmadd213ps_fma(auVar145,auVar51,auVar340);
            auVar54 = vroundps_avx(ZEXT1632(auVar70),1);
            auVar64 = vcmpps_avx(ZEXT1632(auVar70),auVar54,1);
            auVar64 = vandps_avx(auVar64,auVar341);
            auVar64 = vsubps_avx(auVar54,auVar64);
            auVar70 = vfmsub231ps_fma(auVar51,auVar64,auVar333);
            auVar111 = vfnmsub231ps_fma(ZEXT1632(auVar70),auVar64,auVar314);
            auVar51 = ZEXT1632(auVar111);
            auVar19._28_4_ = auVar54._28_4_;
            auVar19._0_28_ =
                 ZEXT1628(CONCAT412(auVar111._12_4_ * auVar111._12_4_,
                                    CONCAT48(auVar111._8_4_ * auVar111._8_4_,
                                             CONCAT44(auVar111._4_4_ * auVar111._4_4_,
                                                      auVar111._0_4_ * auVar111._0_4_))));
            auVar231._8_4_ = 0x39506967;
            auVar231._0_8_ = 0x3950696739506967;
            auVar231._12_4_ = 0x39506967;
            auVar231._16_4_ = 0x39506967;
            auVar231._20_4_ = 0x39506967;
            auVar231._24_4_ = 0x39506967;
            auVar231._28_4_ = 0x39506967;
            auVar342 = ZEXT864(0) << 0x20;
            auVar70 = vfmadd213ps_fma(auVar231,auVar51,auVar336);
            auVar315._8_4_ = 0x3c088908;
            auVar315._0_8_ = 0x3c0889083c088908;
            auVar315._12_4_ = 0x3c088908;
            auVar315._16_4_ = 0x3c088908;
            auVar315._20_4_ = 0x3c088908;
            auVar315._24_4_ = 0x3c088908;
            auVar315._28_4_ = 0x3c088908;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar315);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar214);
            auVar218 = ZEXT3264(auVar341);
            auVar51 = ZEXT1632(auVar111);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar325);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar340);
            auVar114 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar19,auVar51);
            auVar71._0_4_ = (int)auVar64._0_4_;
            auVar71._4_4_ = (int)auVar64._4_4_;
            auVar71._8_4_ = (int)auVar64._8_4_;
            auVar71._12_4_ = (int)auVar64._12_4_;
            auVar88._16_4_ = (int)auVar64._16_4_;
            auVar88._0_16_ = auVar71;
            auVar88._20_4_ = (int)auVar64._20_4_;
            auVar88._24_4_ = (int)auVar64._24_4_;
            auVar88._28_4_ = (int)auVar64._28_4_;
            auVar111 = vpslld_avx(auVar71,0x17);
            auVar70 = vpslld_avx(auVar88._16_16_,0x17);
            auVar70 = vpaddd_avx(auVar70,auVar234);
            auVar111 = vpaddd_avx(auVar111,auVar234);
            auVar89._16_16_ = auVar70;
            auVar89._0_16_ = auVar111;
            auVar146._0_4_ = auVar114._0_4_ + fVar3;
            auVar146._4_4_ = auVar114._4_4_ + fVar157;
            auVar146._8_4_ = auVar114._8_4_ + fVar12;
            auVar146._12_4_ = auVar114._12_4_ + fVar13;
            auVar146._16_4_ = fVar14 + 0.0;
            auVar146._20_4_ = fVar15 + 0.0;
            auVar146._24_4_ = fVar16 + 0.0;
            auVar146._28_4_ = fVar17 + 0.0;
            auVar70 = vfmadd213ps_fma(auVar89,auVar146,auVar341);
            auVar64 = vdivps_avx(auVar341,ZEXT1632(auVar70));
            auVar70 = vfnmadd213ps_fma(auVar64,auVar289,auVar312);
            auVar65 = ZEXT1664(auVar70);
            goto LAB_002bd179;
          case 6:
            puVar9 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar9;
            auVar95._4_4_ = uVar2;
            auVar95._0_4_ = uVar2;
            auVar95._8_4_ = uVar2;
            auVar95._12_4_ = uVar2;
            auVar95._16_4_ = uVar2;
            auVar95._20_4_ = uVar2;
            auVar95._24_4_ = uVar2;
            auVar95._28_4_ = uVar2;
            uVar2 = puVar9[1];
            auVar150._4_4_ = uVar2;
            auVar150._0_4_ = uVar2;
            auVar150._8_4_ = uVar2;
            auVar150._12_4_ = uVar2;
            auVar150._16_4_ = uVar2;
            auVar150._20_4_ = uVar2;
            auVar150._24_4_ = uVar2;
            auVar150._28_4_ = uVar2;
            auVar70 = vfmadd231ps_fma(auVar150,auVar49,auVar95);
            auVar64 = vmaxps_avx(auVar51,ZEXT1632(auVar70));
            auVar64 = vminps_avx(auVar64,auVar341);
            auVar65 = ZEXT3264(auVar64);
LAB_002bd179:
            auVar110._0_4_ = auVar65._0_4_ * fVar42;
            auVar110._4_4_ = auVar65._4_4_ * fVar67;
            auVar110._8_4_ = auVar65._8_4_ * auVar49._8_4_;
            auVar110._12_4_ = auVar65._12_4_ * auVar49._12_4_;
            auVar110._16_4_ = auVar65._16_4_ * auVar49._16_4_;
            auVar110._20_4_ = auVar65._20_4_ * auVar49._20_4_;
            auVar110._28_36_ = auVar65._28_36_;
            auVar110._24_4_ = auVar65._24_4_ * auVar49._24_4_;
            auVar64 = auVar110._0_32_;
          }
switchD_002bcd48_caseD_1:
          *(undefined1 (*) [32])((long)top_blob->data + uVar29 * 0x20) = auVar64;
        }
      }
    }
  }
LAB_002be686:
  if ((int *)local_108._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_108._8_8_ = *(int *)local_108._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_108._8_8_ == 0) {
      if (local_e8 == (Allocator *)0x0) {
        free((void *)local_108._0_8_);
      }
      else {
        (*local_e8->_vptr_Allocator[3])();
      }
    }
  }
  return local_140;
}

Assistant:

int InnerProduct_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}